

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  float fVar47;
  float fVar49;
  float fVar51;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  float fVar48;
  float fVar50;
  float fVar52;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar53;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar72;
  float fVar75;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar73;
  float fVar76;
  float fVar78;
  float fVar79;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar74;
  float fVar77;
  float fVar80;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar81;
  float fVar82;
  float fVar96;
  float fVar97;
  Vec3fa n0;
  float fVar98;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar107 [16];
  float fVar117;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  float fVar116;
  undefined1 auVar114 [64];
  float fVar118;
  float fVar128;
  float fVar129;
  vfloat4 a0;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar130;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float pp;
  float fVar131;
  float fVar143;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  __m128 a;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  float fVar165;
  float fVar166;
  undefined1 auVar164 [64];
  float fVar167;
  float fVar175;
  float fVar177;
  undefined1 auVar169 [16];
  float fVar179;
  undefined1 auVar172 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar168;
  float fVar176;
  float fVar178;
  float fVar180;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  __m128 a_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar190;
  float fVar191;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar192;
  undefined1 auVar189 [32];
  float fVar193;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  float fVar209;
  float fVar210;
  Vec3fa n1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  size_t local_230;
  size_t local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar26 = r->_begin;
  if (uVar26 < r->_end) {
    local_218._8_4_ = 0xff800000;
    local_218._0_8_ = 0xff800000ff800000;
    local_218._12_4_ = 0xff800000;
    local_230 = 0;
    auVar114 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar164 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    local_1f8._8_4_ = 0x7f800000;
    local_1f8._0_8_ = 0x7f8000007f800000;
    local_1f8._12_4_ = 0x7f800000;
    local_208._8_4_ = 0x7f800000;
    local_208._0_8_ = 0x7f8000007f800000;
    local_208._12_4_ = 0x7f800000;
    local_220 = k;
    local_1e8 = local_218;
    do {
      pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar26);
      uVar24 = (ulong)uVar2;
      uVar27 = (ulong)(uVar2 + 3);
      if (uVar27 < (pBVar3->super_RawBufferView).num) {
        uVar28 = (ulong)(uVar2 + 1);
        uVar29 = (ulong)(uVar2 + 2);
        pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        fVar82 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        lVar25 = 0;
        do {
          lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar25);
          lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar25);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar6 * uVar24)),
                                  ZEXT416(*(uint *)(lVar5 + 0xc + lVar6 * uVar28)),0x10);
          auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar5 + 0xc + lVar6 * uVar29)),0x20);
          auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar5 + 0xc + lVar6 * uVar27)),0x30);
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          auVar35 = vandps_avx(auVar35,auVar57);
          auVar57 = auVar114._0_16_;
          auVar35 = vcmpps_avx(auVar35,auVar57,5);
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') goto LAB_0124411e;
          auVar35 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar24);
          auVar32 = auVar164._0_16_;
          auVar149 = vcmpps_avx(auVar35,auVar32,6);
          auVar86 = vcmpps_avx(auVar35,auVar57,1);
          auVar149 = vandps_avx(auVar149,auVar86);
          uVar23 = vmovmskps_avx(auVar149);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          auVar149 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar28);
          auVar86 = vcmpps_avx(auVar149,auVar32,6);
          auVar33 = vcmpps_avx(auVar149,auVar57,1);
          auVar86 = vandps_avx(auVar86,auVar33);
          uVar23 = vmovmskps_avx(auVar86);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          auVar86 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar29);
          auVar33 = vcmpps_avx(auVar86,auVar32,6);
          auVar89 = vcmpps_avx(auVar86,auVar57,1);
          auVar33 = vandps_avx(auVar33,auVar89);
          uVar23 = vmovmskps_avx(auVar33);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar27);
          auVar89 = vcmpps_avx(auVar33,auVar32,6);
          auVar34 = vcmpps_avx(auVar33,auVar57,1);
          auVar89 = vandps_avx(auVar89,auVar34);
          uVar23 = vmovmskps_avx(auVar89);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          lVar5 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar25);
          lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).stride + lVar25);
          auVar89 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar24);
          auVar34 = vcmpps_avx(auVar89,auVar32,6);
          auVar58 = vcmpps_avx(auVar89,auVar57,1);
          auVar34 = vandps_avx(auVar34,auVar58);
          uVar23 = vmovmskps_avx(auVar34);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          auVar34 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar28);
          auVar32 = vcmpps_avx(auVar34,auVar32,6);
          auVar57 = vcmpps_avx(auVar34,auVar57,1);
          auVar57 = vandps_avx(auVar32,auVar57);
          uVar23 = vmovmskps_avx(auVar57);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          auVar57 = vshufps_avx(auVar35,auVar35,0xff);
          auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(auVar57._0_4_ * fVar82)),0x30);
          auVar57 = vshufps_avx(auVar149,auVar149,0xff);
          auVar57 = vinsertps_avx(auVar149,ZEXT416((uint)(auVar57._0_4_ * fVar82)),0x30);
          auVar149 = vshufps_avx(auVar86,auVar86,0xff);
          auVar149 = vinsertps_avx(auVar86,ZEXT416((uint)(auVar149._0_4_ * fVar82)),0x30);
          auVar86 = vshufps_avx(auVar33,auVar33,0xff);
          auVar86 = vinsertps_avx(auVar33,ZEXT416((uint)(auVar86._0_4_ * fVar82)),0x30);
          pfVar1 = (float *)(lVar5 + lVar6 * uVar29);
          fVar167 = *pfVar1;
          fVar118 = pfVar1[1];
          fVar128 = pfVar1[2];
          fVar129 = pfVar1[3];
          pfVar1 = (float *)(lVar5 + lVar6 * uVar27);
          fVar130 = *pfVar1;
          fVar175 = pfVar1[1];
          fVar177 = pfVar1[2];
          fVar179 = pfVar1[3];
          fVar74 = auVar86._0_4_;
          fVar75 = auVar86._4_4_;
          fVar76 = auVar86._8_4_;
          fVar77 = auVar86._12_4_;
          fVar55 = auVar149._0_4_;
          fVar56 = auVar149._4_4_;
          fVar72 = auVar149._8_4_;
          fVar73 = auVar149._12_4_;
          fVar50 = auVar57._0_4_;
          fVar52 = auVar57._4_4_;
          fVar53 = auVar57._8_4_;
          fVar54 = auVar57._12_4_;
          auVar144._0_4_ = fVar50 * 0.0 + fVar55 * 0.5 + fVar74 * 0.0;
          auVar144._4_4_ = fVar52 * 0.0 + fVar56 * 0.5 + fVar75 * 0.0;
          auVar144._8_4_ = fVar53 * 0.0 + fVar72 * 0.5 + fVar76 * 0.0;
          auVar144._12_4_ = fVar54 * 0.0 + fVar73 * 0.5 + fVar77 * 0.0;
          fVar131 = auVar35._0_4_;
          auVar185._0_4_ = fVar131 * 0.5;
          fVar143 = auVar35._4_4_;
          auVar185._4_4_ = fVar143 * 0.5;
          fVar31 = auVar35._8_4_;
          auVar185._8_4_ = fVar31 * 0.5;
          fVar48 = auVar35._12_4_;
          auVar185._12_4_ = fVar48 * 0.5;
          auVar61 = vsubps_avx(auVar144,auVar185);
          fVar78 = auVar34._0_4_;
          fVar79 = auVar34._4_4_;
          fVar80 = auVar34._8_4_;
          fVar99 = auVar34._12_4_;
          auVar186._0_4_ = fVar78 * 0.0 + fVar167 * 0.5 + fVar130 * 0.0;
          auVar186._4_4_ = fVar79 * 0.0 + fVar118 * 0.5 + fVar175 * 0.0;
          auVar186._8_4_ = fVar80 * 0.0 + fVar128 * 0.5 + fVar177 * 0.0;
          auVar186._12_4_ = fVar99 * 0.0 + fVar129 * 0.5 + fVar179 * 0.0;
          fVar81 = auVar89._0_4_;
          auVar100._0_4_ = fVar81 * 0.5;
          fVar96 = auVar89._4_4_;
          auVar100._4_4_ = fVar96 * 0.5;
          fVar97 = auVar89._8_4_;
          auVar100._8_4_ = fVar97 * 0.5;
          fVar98 = auVar89._12_4_;
          auVar100._12_4_ = fVar98 * 0.5;
          auVar86 = vsubps_avx(auVar186,auVar100);
          fVar30 = fVar131 * -0.0 + fVar50 + fVar55 * 0.0 + fVar74 * -0.0;
          fVar47 = fVar143 * -0.0 + fVar52 + fVar56 * 0.0 + fVar75 * -0.0;
          fVar49 = fVar31 * -0.0 + fVar53 + fVar72 * 0.0 + fVar76 * -0.0;
          fVar51 = fVar48 * -0.0 + fVar54 + fVar73 * 0.0 + fVar77 * -0.0;
          auVar156._0_4_ = fVar50 * 0.0 + fVar55 + fVar74 * -0.0 + fVar131 * -0.0;
          auVar156._4_4_ = fVar52 * 0.0 + fVar56 + fVar75 * -0.0 + fVar143 * -0.0;
          auVar156._8_4_ = fVar53 * 0.0 + fVar72 + fVar76 * -0.0 + fVar31 * -0.0;
          auVar156._12_4_ = fVar54 * 0.0 + fVar73 + fVar77 * -0.0 + fVar48 * -0.0;
          auVar169._0_4_ = fVar55 * 0.0 + fVar74 * 0.5;
          auVar169._4_4_ = fVar56 * 0.0 + fVar75 * 0.5;
          auVar169._8_4_ = fVar72 * 0.0 + fVar76 * 0.5;
          auVar169._12_4_ = fVar73 * 0.0 + fVar77 * 0.5;
          auVar101._0_4_ = fVar81 * -0.0 + fVar78 + fVar167 * 0.0 + fVar130 * -0.0;
          auVar101._4_4_ = fVar96 * -0.0 + fVar79 + fVar118 * 0.0 + fVar175 * -0.0;
          auVar101._8_4_ = fVar97 * -0.0 + fVar80 + fVar128 * 0.0 + fVar177 * -0.0;
          auVar101._12_4_ = fVar98 * -0.0 + fVar99 + fVar129 * 0.0 + fVar179 * -0.0;
          auVar148._0_4_ = fVar50 * 0.5;
          auVar148._4_4_ = fVar52 * 0.5;
          auVar148._8_4_ = fVar53 * 0.5;
          auVar148._12_4_ = fVar54 * 0.5;
          auVar35 = vsubps_avx(auVar169,auVar148);
          auVar181._0_4_ = fVar131 * 0.0 + auVar35._0_4_;
          auVar181._4_4_ = fVar143 * 0.0 + auVar35._4_4_;
          auVar181._8_4_ = fVar31 * 0.0 + auVar35._8_4_;
          auVar181._12_4_ = fVar48 * 0.0 + auVar35._12_4_;
          auVar32._0_4_ = fVar81 * -0.0 + fVar78 * 0.0 + fVar130 * -0.0 + fVar167;
          auVar32._4_4_ = fVar96 * -0.0 + fVar79 * 0.0 + fVar175 * -0.0 + fVar118;
          auVar32._8_4_ = fVar97 * -0.0 + fVar80 * 0.0 + fVar177 * -0.0 + fVar128;
          auVar32._12_4_ = fVar98 * -0.0 + fVar99 * 0.0 + fVar179 * -0.0 + fVar129;
          auVar35._0_4_ = fVar167 * 0.0 + fVar130 * 0.5;
          auVar35._4_4_ = fVar118 * 0.0 + fVar175 * 0.5;
          auVar35._8_4_ = fVar128 * 0.0 + fVar177 * 0.5;
          auVar35._12_4_ = fVar129 * 0.0 + fVar179 * 0.5;
          auVar119._0_4_ = fVar78 * 0.5;
          auVar119._4_4_ = fVar79 * 0.5;
          auVar119._8_4_ = fVar80 * 0.5;
          auVar119._12_4_ = fVar99 * 0.5;
          auVar35 = vsubps_avx(auVar35,auVar119);
          auVar83._0_4_ = fVar81 * 0.0 + auVar35._0_4_;
          auVar83._4_4_ = fVar96 * 0.0 + auVar35._4_4_;
          auVar83._8_4_ = fVar97 * 0.0 + auVar35._8_4_;
          auVar83._12_4_ = fVar98 * 0.0 + auVar35._12_4_;
          auVar35 = vshufps_avx(auVar61,auVar61,0xc9);
          auVar57 = vshufps_avx(auVar101,auVar101,0xc9);
          fVar131 = auVar61._0_4_;
          auVar120._0_4_ = fVar131 * auVar57._0_4_;
          fVar48 = auVar61._4_4_;
          auVar120._4_4_ = fVar48 * auVar57._4_4_;
          fVar53 = auVar61._8_4_;
          auVar120._8_4_ = fVar53 * auVar57._8_4_;
          fVar56 = auVar61._12_4_;
          auVar120._12_4_ = fVar56 * auVar57._12_4_;
          auVar102._0_4_ = auVar101._0_4_ * auVar35._0_4_;
          auVar102._4_4_ = auVar101._4_4_ * auVar35._4_4_;
          auVar102._8_4_ = auVar101._8_4_ * auVar35._8_4_;
          auVar102._12_4_ = auVar101._12_4_ * auVar35._12_4_;
          auVar57 = vsubps_avx(auVar102,auVar120);
          auVar149 = vshufps_avx(auVar57,auVar57,0xc9);
          auVar57 = vshufps_avx(auVar86,auVar86,0xc9);
          auVar103._0_4_ = fVar131 * auVar57._0_4_;
          auVar103._4_4_ = fVar48 * auVar57._4_4_;
          auVar103._8_4_ = fVar53 * auVar57._8_4_;
          auVar103._12_4_ = fVar56 * auVar57._12_4_;
          auVar58._0_4_ = auVar86._0_4_ * auVar35._0_4_;
          auVar58._4_4_ = auVar86._4_4_ * auVar35._4_4_;
          auVar58._8_4_ = auVar86._8_4_ * auVar35._8_4_;
          auVar58._12_4_ = auVar86._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar58,auVar103);
          auVar86 = vshufps_avx(auVar35,auVar35,0xc9);
          auVar35 = vshufps_avx(auVar181,auVar181,0xc9);
          auVar57 = vshufps_avx(auVar32,auVar32,0xc9);
          auVar59._0_4_ = auVar181._0_4_ * auVar57._0_4_;
          auVar59._4_4_ = auVar181._4_4_ * auVar57._4_4_;
          auVar59._8_4_ = auVar181._8_4_ * auVar57._8_4_;
          auVar59._12_4_ = auVar181._12_4_ * auVar57._12_4_;
          auVar33._0_4_ = auVar32._0_4_ * auVar35._0_4_;
          auVar33._4_4_ = auVar32._4_4_ * auVar35._4_4_;
          auVar33._8_4_ = auVar32._8_4_ * auVar35._8_4_;
          auVar33._12_4_ = auVar32._12_4_ * auVar35._12_4_;
          auVar57 = vsubps_avx(auVar33,auVar59);
          auVar32 = vshufps_avx(auVar57,auVar57,0xc9);
          auVar57 = vshufps_avx(auVar83,auVar83,0xc9);
          auVar34._0_4_ = auVar181._0_4_ * auVar57._0_4_;
          auVar34._4_4_ = auVar181._4_4_ * auVar57._4_4_;
          auVar34._8_4_ = auVar181._8_4_ * auVar57._8_4_;
          auVar34._12_4_ = auVar181._12_4_ * auVar57._12_4_;
          auVar84._0_4_ = auVar83._0_4_ * auVar35._0_4_;
          auVar84._4_4_ = auVar83._4_4_ * auVar35._4_4_;
          auVar84._8_4_ = auVar83._8_4_ * auVar35._8_4_;
          auVar84._12_4_ = auVar83._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar84,auVar34);
          auVar33 = vshufps_avx(auVar35,auVar35,0xc9);
          auVar35 = vdpps_avx(auVar149,auVar149,0x7f);
          fVar167 = auVar35._0_4_;
          auVar34 = ZEXT416((uint)fVar167);
          auVar57 = vrsqrtss_avx(auVar34,auVar34);
          fVar118 = auVar57._0_4_;
          auVar57 = vdpps_avx(auVar149,auVar86,0x7f);
          auVar89 = ZEXT416((uint)(fVar118 * 1.5 - fVar167 * 0.5 * fVar118 * fVar118 * fVar118));
          auVar89 = vshufps_avx(auVar89,auVar89,0);
          fVar118 = auVar89._0_4_ * auVar149._0_4_;
          fVar128 = auVar89._4_4_ * auVar149._4_4_;
          fVar129 = auVar89._8_4_ * auVar149._8_4_;
          fVar130 = auVar89._12_4_ * auVar149._12_4_;
          auVar35 = vshufps_avx(auVar35,auVar35,0);
          auVar104._0_4_ = auVar35._0_4_ * auVar86._0_4_;
          auVar104._4_4_ = auVar35._4_4_ * auVar86._4_4_;
          auVar104._8_4_ = auVar35._8_4_ * auVar86._8_4_;
          auVar104._12_4_ = auVar35._12_4_ * auVar86._12_4_;
          auVar35 = vshufps_avx(auVar57,auVar57,0);
          auVar132._0_4_ = auVar35._0_4_ * auVar149._0_4_;
          auVar132._4_4_ = auVar35._4_4_ * auVar149._4_4_;
          auVar132._8_4_ = auVar35._8_4_ * auVar149._8_4_;
          auVar132._12_4_ = auVar35._12_4_ * auVar149._12_4_;
          auVar59 = vsubps_avx(auVar104,auVar132);
          auVar35 = vrcpss_avx(auVar34,auVar34);
          auVar35 = ZEXT416((uint)(auVar35._0_4_ * (2.0 - fVar167 * auVar35._0_4_)));
          auVar86 = vshufps_avx(auVar35,auVar35,0);
          auVar57 = vdpps_avx(auVar32,auVar32,0x7f);
          auVar35 = vblendps_avx(auVar57,_DAT_01f7aa10,0xe);
          auVar149 = vrsqrtss_avx(auVar35,auVar35);
          fVar167 = auVar149._0_4_;
          auVar149 = ZEXT416((uint)(fVar167 * 1.5 -
                                   auVar57._0_4_ * 0.5 * fVar167 * fVar167 * fVar167));
          auVar34 = vshufps_avx(auVar149,auVar149,0);
          fVar167 = auVar32._0_4_ * auVar34._0_4_;
          fVar175 = auVar32._4_4_ * auVar34._4_4_;
          fVar177 = auVar32._8_4_ * auVar34._8_4_;
          fVar179 = auVar32._12_4_ * auVar34._12_4_;
          auVar149 = vdpps_avx(auVar32,auVar33,0x7f);
          auVar58 = vshufps_avx(auVar57,auVar57,0);
          auVar85._0_4_ = auVar58._0_4_ * auVar33._0_4_;
          auVar85._4_4_ = auVar58._4_4_ * auVar33._4_4_;
          auVar85._8_4_ = auVar58._8_4_ * auVar33._8_4_;
          auVar85._12_4_ = auVar58._12_4_ * auVar33._12_4_;
          auVar149 = vshufps_avx(auVar149,auVar149,0);
          auVar60._0_4_ = auVar149._0_4_ * auVar32._0_4_;
          auVar60._4_4_ = auVar149._4_4_ * auVar32._4_4_;
          auVar60._8_4_ = auVar149._8_4_ * auVar32._8_4_;
          auVar60._12_4_ = auVar149._12_4_ * auVar32._12_4_;
          auVar32 = vsubps_avx(auVar85,auVar60);
          auVar35 = vrcpss_avx(auVar35,auVar35);
          auVar35 = ZEXT416((uint)(auVar35._0_4_ * (2.0 - auVar57._0_4_ * auVar35._0_4_)));
          auVar35 = vshufps_avx(auVar35,auVar35,0);
          auVar149._4_4_ = fVar47;
          auVar149._0_4_ = fVar30;
          auVar149._8_4_ = fVar49;
          auVar149._12_4_ = fVar51;
          auVar57 = vshufps_avx(auVar149,auVar149,0xff);
          auVar133._0_4_ = auVar57._0_4_ * fVar118;
          auVar133._4_4_ = auVar57._4_4_ * fVar128;
          auVar133._8_4_ = auVar57._8_4_ * fVar129;
          auVar133._12_4_ = auVar57._12_4_ * fVar130;
          auVar58 = vsubps_avx(auVar149,auVar133);
          auVar149 = vshufps_avx(auVar61,auVar61,0xff);
          auVar105._0_4_ =
               auVar149._0_4_ * fVar118 +
               auVar57._0_4_ * auVar89._0_4_ * auVar59._0_4_ * auVar86._0_4_;
          auVar105._4_4_ =
               auVar149._4_4_ * fVar128 +
               auVar57._4_4_ * auVar89._4_4_ * auVar59._4_4_ * auVar86._4_4_;
          auVar105._8_4_ =
               auVar149._8_4_ * fVar129 +
               auVar57._8_4_ * auVar89._8_4_ * auVar59._8_4_ * auVar86._8_4_;
          auVar105._12_4_ =
               auVar149._12_4_ * fVar130 +
               auVar57._12_4_ * auVar89._12_4_ * auVar59._12_4_ * auVar86._12_4_;
          auVar86 = vsubps_avx(auVar61,auVar105);
          fVar30 = fVar30 + auVar133._0_4_;
          fVar47 = fVar47 + auVar133._4_4_;
          fVar49 = fVar49 + auVar133._8_4_;
          fVar51 = fVar51 + auVar133._12_4_;
          auVar57 = vshufps_avx(auVar156,auVar156,0xff);
          auVar150._0_4_ = fVar167 * auVar57._0_4_;
          auVar150._4_4_ = fVar175 * auVar57._4_4_;
          auVar150._8_4_ = fVar177 * auVar57._8_4_;
          auVar150._12_4_ = fVar179 * auVar57._12_4_;
          auVar33 = vsubps_avx(auVar156,auVar150);
          auVar149 = vshufps_avx(auVar181,auVar181,0xff);
          auVar61._0_4_ =
               auVar149._0_4_ * fVar167 +
               auVar57._0_4_ * auVar34._0_4_ * auVar32._0_4_ * auVar35._0_4_;
          auVar61._4_4_ =
               auVar149._4_4_ * fVar175 +
               auVar57._4_4_ * auVar34._4_4_ * auVar32._4_4_ * auVar35._4_4_;
          auVar61._8_4_ =
               auVar149._8_4_ * fVar177 +
               auVar57._8_4_ * auVar34._8_4_ * auVar32._8_4_ * auVar35._8_4_;
          auVar61._12_4_ =
               auVar149._12_4_ * fVar179 +
               auVar57._12_4_ * auVar34._12_4_ * auVar32._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar181,auVar61);
          local_248._4_4_ = auVar156._4_4_ + auVar150._4_4_;
          local_248._0_4_ = auVar156._0_4_ + auVar150._0_4_;
          fStack_240 = auVar156._8_4_ + auVar150._8_4_;
          fStack_23c = auVar156._12_4_ + auVar150._12_4_;
          auVar62._0_4_ = auVar58._0_4_ + auVar86._0_4_ * 0.33333334;
          auVar62._4_4_ = auVar58._4_4_ + auVar86._4_4_ * 0.33333334;
          auVar62._8_4_ = auVar58._8_4_ + auVar86._8_4_ * 0.33333334;
          auVar62._12_4_ = auVar58._12_4_ + auVar86._12_4_ * 0.33333334;
          auVar106._0_4_ = auVar35._0_4_ * 0.33333334;
          auVar106._4_4_ = auVar35._4_4_ * 0.33333334;
          auVar106._8_4_ = auVar35._8_4_ * 0.33333334;
          auVar106._12_4_ = auVar35._12_4_ * 0.33333334;
          auVar149 = vsubps_avx(auVar33,auVar106);
          auVar35 = vshufps_avx(auVar149,auVar149,0);
          auVar57 = vshufps_avx(auVar149,auVar149,0x55);
          auVar149 = vshufps_avx(auVar149,auVar149,0xaa);
          auVar86 = vshufps_avx(auVar33,auVar33,0);
          auVar32 = vshufps_avx(auVar33,auVar33,0x55);
          auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
          fVar77 = auVar86._0_4_;
          fVar78 = auVar86._4_4_;
          fVar79 = auVar86._8_4_;
          fVar80 = auVar86._12_4_;
          fVar81 = auVar32._0_4_;
          fVar96 = auVar32._4_4_;
          fVar97 = auVar32._8_4_;
          fVar98 = auVar32._12_4_;
          fVar117 = auVar33._0_4_;
          fVar155 = auVar33._4_4_;
          fVar165 = auVar33._8_4_;
          fVar166 = auVar33._12_4_;
          fVar191 = auVar35._0_4_;
          fVar192 = auVar35._4_4_;
          fVar193 = auVar35._8_4_;
          fVar143 = auVar57._0_4_;
          fVar50 = auVar57._4_4_;
          fVar54 = auVar57._8_4_;
          fVar72 = auVar57._12_4_;
          fVar74 = auVar149._0_4_;
          fVar75 = auVar149._4_4_;
          fVar76 = auVar149._8_4_;
          auVar57 = vshufps_avx(auVar62,auVar62,0);
          fVar180 = auVar57._0_4_;
          fVar184 = auVar57._4_4_;
          fVar190 = auVar57._8_4_;
          auVar86 = vshufps_avx(auVar62,auVar62,0x55);
          fVar31 = auVar86._0_4_;
          fVar52 = auVar86._4_4_;
          fVar55 = auVar86._8_4_;
          fVar73 = auVar86._12_4_;
          auVar86 = vshufps_avx(auVar62,auVar62,0xaa);
          fVar168 = auVar86._0_4_;
          fVar176 = auVar86._4_4_;
          fVar178 = auVar86._8_4_;
          auVar32 = vshufps_avx(auVar58,auVar58,0);
          fVar99 = auVar32._0_4_;
          fVar115 = auVar32._4_4_;
          fVar116 = auVar32._8_4_;
          auVar201._0_4_ =
               fVar99 * (float)bezier_basis0._476_4_ +
               fVar180 * (float)bezier_basis0._1632_4_ +
               fVar191 * (float)bezier_basis0._2788_4_ + fVar77 * (float)bezier_basis0._3944_4_;
          auVar201._4_4_ =
               fVar115 * (float)bezier_basis0._480_4_ +
               fVar184 * (float)bezier_basis0._1636_4_ +
               fVar192 * (float)bezier_basis0._2792_4_ + fVar78 * (float)bezier_basis0._3948_4_;
          auVar201._8_4_ =
               fVar116 * (float)bezier_basis0._484_4_ +
               fVar190 * (float)bezier_basis0._1640_4_ +
               fVar193 * (float)bezier_basis0._2796_4_ + fVar79 * (float)bezier_basis0._3952_4_;
          auVar201._12_4_ =
               auVar32._12_4_ * (float)bezier_basis0._488_4_ +
               auVar57._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar35._12_4_ * (float)bezier_basis0._2800_4_ +
               fVar80 * (float)bezier_basis0._3956_4_;
          auVar201._16_4_ =
               fVar99 * (float)bezier_basis0._492_4_ +
               fVar180 * (float)bezier_basis0._1648_4_ +
               fVar191 * (float)bezier_basis0._2804_4_ + fVar77 * (float)bezier_basis0._3960_4_;
          auVar201._20_4_ =
               fVar115 * (float)bezier_basis0._496_4_ +
               fVar184 * (float)bezier_basis0._1652_4_ +
               fVar192 * (float)bezier_basis0._2808_4_ + fVar78 * (float)bezier_basis0._3964_4_;
          auVar201._24_4_ =
               fVar116 * (float)bezier_basis0._500_4_ +
               fVar190 * (float)bezier_basis0._1656_4_ +
               fVar193 * (float)bezier_basis0._2812_4_ + fVar79 * (float)bezier_basis0._3968_4_;
          auVar201._28_4_ = fVar72 + 0.0 + 0.0;
          auVar33 = vshufps_avx(auVar58,auVar58,0x55);
          fVar167 = auVar33._0_4_;
          fVar118 = auVar33._4_4_;
          fVar128 = auVar33._8_4_;
          fVar129 = auVar33._12_4_;
          auVar140._0_4_ =
               (float)bezier_basis0._476_4_ * fVar167 +
               fVar31 * (float)bezier_basis0._1632_4_ +
               fVar143 * (float)bezier_basis0._2788_4_ + fVar81 * (float)bezier_basis0._3944_4_;
          auVar140._4_4_ =
               (float)bezier_basis0._480_4_ * fVar118 +
               fVar52 * (float)bezier_basis0._1636_4_ +
               fVar50 * (float)bezier_basis0._2792_4_ + fVar96 * (float)bezier_basis0._3948_4_;
          auVar140._8_4_ =
               (float)bezier_basis0._484_4_ * fVar128 +
               fVar55 * (float)bezier_basis0._1640_4_ +
               fVar54 * (float)bezier_basis0._2796_4_ + fVar97 * (float)bezier_basis0._3952_4_;
          auVar140._12_4_ =
               (float)bezier_basis0._488_4_ * fVar129 +
               fVar73 * (float)bezier_basis0._1644_4_ +
               fVar72 * (float)bezier_basis0._2800_4_ + fVar98 * (float)bezier_basis0._3956_4_;
          auVar140._16_4_ =
               (float)bezier_basis0._492_4_ * fVar167 +
               fVar31 * (float)bezier_basis0._1648_4_ +
               fVar143 * (float)bezier_basis0._2804_4_ + fVar81 * (float)bezier_basis0._3960_4_;
          auVar140._20_4_ =
               (float)bezier_basis0._496_4_ * fVar118 +
               fVar52 * (float)bezier_basis0._1652_4_ +
               fVar50 * (float)bezier_basis0._2808_4_ + fVar96 * (float)bezier_basis0._3964_4_;
          auVar140._24_4_ =
               (float)bezier_basis0._500_4_ * fVar128 +
               fVar55 * (float)bezier_basis0._1656_4_ +
               fVar54 * (float)bezier_basis0._2812_4_ + fVar97 * (float)bezier_basis0._3968_4_;
          auVar140._28_4_ = (float)bezier_basis0._504_4_ + 0.0;
          auVar33 = vshufps_avx(auVar58,auVar58,0xaa);
          fVar130 = auVar33._0_4_;
          fVar175 = auVar33._4_4_;
          fVar177 = auVar33._8_4_;
          fVar179 = auVar33._12_4_;
          auVar154._0_4_ =
               fVar130 * (float)bezier_basis0._476_4_ +
               fVar168 * (float)bezier_basis0._1632_4_ +
               fVar74 * (float)bezier_basis0._2788_4_ + fVar117 * (float)bezier_basis0._3944_4_;
          auVar154._4_4_ =
               fVar175 * (float)bezier_basis0._480_4_ +
               fVar176 * (float)bezier_basis0._1636_4_ +
               fVar75 * (float)bezier_basis0._2792_4_ + fVar155 * (float)bezier_basis0._3948_4_;
          auVar154._8_4_ =
               fVar177 * (float)bezier_basis0._484_4_ +
               fVar178 * (float)bezier_basis0._1640_4_ +
               fVar76 * (float)bezier_basis0._2796_4_ + fVar165 * (float)bezier_basis0._3952_4_;
          auVar154._12_4_ =
               fVar179 * (float)bezier_basis0._488_4_ +
               auVar86._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar149._12_4_ * (float)bezier_basis0._2800_4_ +
               fVar166 * (float)bezier_basis0._3956_4_;
          auVar154._16_4_ =
               fVar130 * (float)bezier_basis0._492_4_ +
               fVar168 * (float)bezier_basis0._1648_4_ +
               fVar74 * (float)bezier_basis0._2804_4_ + fVar117 * (float)bezier_basis0._3960_4_;
          auVar154._20_4_ =
               fVar175 * (float)bezier_basis0._496_4_ +
               fVar176 * (float)bezier_basis0._1652_4_ +
               fVar75 * (float)bezier_basis0._2808_4_ + fVar155 * (float)bezier_basis0._3964_4_;
          auVar154._24_4_ =
               fVar177 * (float)bezier_basis0._500_4_ +
               fVar178 * (float)bezier_basis0._1656_4_ +
               fVar76 * (float)bezier_basis0._2812_4_ + fVar165 * (float)bezier_basis0._3968_4_;
          auVar154._28_4_ = (float)bezier_basis0._504_4_ + 0.0;
          auVar40._0_4_ =
               fVar180 * (float)bezier_basis0._6256_4_ +
               fVar191 * (float)bezier_basis0._7412_4_ + fVar77 * (float)bezier_basis0._8568_4_ +
               fVar99 * (float)bezier_basis0._5100_4_;
          auVar40._4_4_ =
               fVar184 * (float)bezier_basis0._6260_4_ +
               fVar192 * (float)bezier_basis0._7416_4_ + fVar78 * (float)bezier_basis0._8572_4_ +
               fVar115 * (float)bezier_basis0._5104_4_;
          auVar40._8_4_ =
               fVar190 * (float)bezier_basis0._6264_4_ +
               fVar193 * (float)bezier_basis0._7420_4_ + fVar79 * (float)bezier_basis0._8576_4_ +
               fVar116 * (float)bezier_basis0._5108_4_;
          auVar40._12_4_ =
               auVar57._12_4_ * (float)bezier_basis0._6268_4_ +
               auVar35._12_4_ * (float)bezier_basis0._7424_4_ +
               fVar80 * (float)bezier_basis0._8580_4_ +
               auVar32._12_4_ * (float)bezier_basis0._5112_4_;
          auVar40._16_4_ =
               fVar180 * (float)bezier_basis0._6272_4_ +
               fVar191 * (float)bezier_basis0._7428_4_ + fVar77 * (float)bezier_basis0._8584_4_ +
               fVar99 * (float)bezier_basis0._5116_4_;
          auVar40._20_4_ =
               fVar184 * (float)bezier_basis0._6276_4_ +
               fVar192 * (float)bezier_basis0._7432_4_ + fVar78 * (float)bezier_basis0._8588_4_ +
               fVar115 * (float)bezier_basis0._5120_4_;
          auVar40._24_4_ =
               fVar190 * (float)bezier_basis0._6280_4_ +
               fVar193 * (float)bezier_basis0._7436_4_ + fVar79 * (float)bezier_basis0._8592_4_ +
               fVar116 * (float)bezier_basis0._5124_4_;
          auVar40._28_4_ =
               fVar166 + fVar80 + (float)bezier_basis0._504_4_ + (float)bezier_basis0._6284_4_;
          auVar109._0_4_ =
               fVar167 * (float)bezier_basis0._5100_4_ +
               fVar31 * (float)bezier_basis0._6256_4_ +
               fVar81 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar143;
          auVar109._4_4_ =
               fVar118 * (float)bezier_basis0._5104_4_ +
               fVar52 * (float)bezier_basis0._6260_4_ +
               fVar96 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar50;
          auVar109._8_4_ =
               fVar128 * (float)bezier_basis0._5108_4_ +
               fVar55 * (float)bezier_basis0._6264_4_ +
               fVar97 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar54;
          auVar109._12_4_ =
               fVar129 * (float)bezier_basis0._5112_4_ +
               fVar73 * (float)bezier_basis0._6268_4_ +
               fVar98 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._7424_4_ * fVar72;
          auVar109._16_4_ =
               fVar167 * (float)bezier_basis0._5116_4_ +
               fVar31 * (float)bezier_basis0._6272_4_ +
               fVar81 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar143;
          auVar109._20_4_ =
               fVar118 * (float)bezier_basis0._5120_4_ +
               fVar52 * (float)bezier_basis0._6276_4_ +
               fVar96 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar50;
          auVar109._24_4_ =
               fVar128 * (float)bezier_basis0._5124_4_ +
               fVar55 * (float)bezier_basis0._6280_4_ +
               fVar97 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar54;
          auVar109._28_4_ = fVar129 + fVar73 + fVar80 + fVar98;
          auVar91._0_4_ =
               fVar130 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._7412_4_ * fVar74 + fVar117 * (float)bezier_basis0._8568_4_ +
               fVar168 * (float)bezier_basis0._6256_4_;
          auVar91._4_4_ =
               fVar175 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._7416_4_ * fVar75 + fVar155 * (float)bezier_basis0._8572_4_ +
               fVar176 * (float)bezier_basis0._6260_4_;
          auVar91._8_4_ =
               fVar177 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._7420_4_ * fVar76 + fVar165 * (float)bezier_basis0._8576_4_ +
               fVar178 * (float)bezier_basis0._6264_4_;
          auVar91._12_4_ =
               fVar179 * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._7424_4_ * auVar149._12_4_ +
               fVar166 * (float)bezier_basis0._8580_4_ +
               auVar86._12_4_ * (float)bezier_basis0._6268_4_;
          auVar91._16_4_ =
               fVar130 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._7428_4_ * fVar74 + fVar117 * (float)bezier_basis0._8584_4_ +
               fVar168 * (float)bezier_basis0._6272_4_;
          auVar91._20_4_ =
               fVar175 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._7432_4_ * fVar75 + fVar155 * (float)bezier_basis0._8588_4_ +
               fVar176 * (float)bezier_basis0._6276_4_;
          auVar91._24_4_ =
               fVar177 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._7436_4_ * fVar76 + fVar165 * (float)bezier_basis0._8592_4_ +
               fVar178 * (float)bezier_basis0._6280_4_;
          auVar91._28_4_ = fVar179 + fVar166 + fVar80 + fVar73;
          auVar9 = vblendps_avx(auVar40,ZEXT832(0) << 0x20,1);
          auVar173 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,1);
          auVar182 = ZEXT832(0) << 0x20;
          auVar92 = vblendps_avx(auVar91,auVar182,1);
          auVar174._4_4_ = auVar9._4_4_ * 0.055555556;
          auVar174._0_4_ = auVar9._0_4_ * 0.055555556;
          auVar174._8_4_ = auVar9._8_4_ * 0.055555556;
          auVar174._12_4_ = auVar9._12_4_ * 0.055555556;
          auVar174._16_4_ = auVar9._16_4_ * 0.055555556;
          auVar174._20_4_ = auVar9._20_4_ * 0.055555556;
          auVar174._24_4_ = auVar9._24_4_ * 0.055555556;
          auVar174._28_4_ = auVar9._28_4_;
          auVar9._4_4_ = auVar173._4_4_ * 0.055555556;
          auVar9._0_4_ = auVar173._0_4_ * 0.055555556;
          auVar9._8_4_ = auVar173._8_4_ * 0.055555556;
          auVar9._12_4_ = auVar173._12_4_ * 0.055555556;
          auVar9._16_4_ = auVar173._16_4_ * 0.055555556;
          auVar9._20_4_ = auVar173._20_4_ * 0.055555556;
          auVar9._24_4_ = auVar173._24_4_ * 0.055555556;
          auVar9._28_4_ = auVar173._28_4_;
          auVar173._4_4_ = auVar92._4_4_ * 0.055555556;
          auVar173._0_4_ = auVar92._0_4_ * 0.055555556;
          auVar173._8_4_ = auVar92._8_4_ * 0.055555556;
          auVar173._12_4_ = auVar92._12_4_ * 0.055555556;
          auVar173._16_4_ = auVar92._16_4_ * 0.055555556;
          auVar173._20_4_ = auVar92._20_4_ * 0.055555556;
          auVar173._24_4_ = auVar92._24_4_ * 0.055555556;
          auVar173._28_4_ = auVar92._28_4_;
          auVar174 = vsubps_avx(auVar201,auVar174);
          auVar141 = vsubps_avx(auVar140,auVar9);
          auVar13 = vsubps_avx(auVar154,auVar173);
          auVar9 = vblendps_avx(auVar40,auVar182,0x80);
          auVar173 = vblendps_avx(auVar109,auVar182,0x80);
          auVar92 = vblendps_avx(auVar91,auVar182,0x80);
          auVar41._0_4_ = auVar201._0_4_ + auVar9._0_4_ * 0.055555556;
          auVar41._4_4_ = auVar201._4_4_ + auVar9._4_4_ * 0.055555556;
          auVar41._8_4_ = auVar201._8_4_ + auVar9._8_4_ * 0.055555556;
          auVar41._12_4_ = auVar201._12_4_ + auVar9._12_4_ * 0.055555556;
          auVar41._16_4_ = auVar201._16_4_ + auVar9._16_4_ * 0.055555556;
          auVar41._20_4_ = auVar201._20_4_ + auVar9._20_4_ * 0.055555556;
          auVar41._24_4_ = auVar201._24_4_ + auVar9._24_4_ * 0.055555556;
          auVar41._28_4_ = auVar201._28_4_ + auVar9._28_4_;
          auVar110._0_4_ = auVar140._0_4_ + auVar173._0_4_ * 0.055555556;
          auVar110._4_4_ = auVar140._4_4_ + auVar173._4_4_ * 0.055555556;
          auVar110._8_4_ = auVar140._8_4_ + auVar173._8_4_ * 0.055555556;
          auVar110._12_4_ = auVar140._12_4_ + auVar173._12_4_ * 0.055555556;
          auVar110._16_4_ = auVar140._16_4_ + auVar173._16_4_ * 0.055555556;
          auVar110._20_4_ = auVar140._20_4_ + auVar173._20_4_ * 0.055555556;
          auVar110._24_4_ = auVar140._24_4_ + auVar173._24_4_ * 0.055555556;
          auVar110._28_4_ = auVar140._28_4_ + auVar173._28_4_;
          auVar172._0_4_ = auVar154._0_4_ + auVar92._0_4_ * 0.055555556;
          auVar172._4_4_ = auVar154._4_4_ + auVar92._4_4_ * 0.055555556;
          auVar172._8_4_ = auVar154._8_4_ + auVar92._8_4_ * 0.055555556;
          auVar172._12_4_ = auVar154._12_4_ + auVar92._12_4_ * 0.055555556;
          auVar172._16_4_ = auVar154._16_4_ + auVar92._16_4_ * 0.055555556;
          auVar172._20_4_ = auVar154._20_4_ + auVar92._20_4_ * 0.055555556;
          auVar172._24_4_ = auVar154._24_4_ + auVar92._24_4_ * 0.055555556;
          auVar172._28_4_ = auVar154._28_4_ + auVar92._28_4_;
          auVar67._8_4_ = 0x7f800000;
          auVar67._0_8_ = 0x7f8000007f800000;
          auVar67._12_4_ = 0x7f800000;
          auVar67._16_4_ = 0x7f800000;
          auVar67._20_4_ = 0x7f800000;
          auVar67._24_4_ = 0x7f800000;
          auVar67._28_4_ = 0x7f800000;
          auVar9 = vminps_avx(auVar67,auVar201);
          auVar173 = vminps_avx(auVar67,auVar140);
          auVar92 = vminps_avx(auVar174,auVar41);
          auVar182 = vminps_avx(auVar9,auVar92);
          auVar9 = vminps_avx(auVar141,auVar110);
          auVar12 = vminps_avx(auVar173,auVar9);
          auVar9 = vminps_avx(auVar67,auVar154);
          auVar173 = vminps_avx(auVar13,auVar172);
          auVar194 = vminps_avx(auVar9,auVar173);
          auVar205._0_4_ = (fVar131 + auVar105._0_4_) * 0.33333334 + fVar30;
          auVar205._4_4_ = (fVar48 + auVar105._4_4_) * 0.33333334 + fVar47;
          auVar205._8_4_ = (fVar53 + auVar105._8_4_) * 0.33333334 + fVar49;
          auVar205._12_4_ = (fVar56 + auVar105._12_4_) * 0.33333334 + fVar51;
          auVar86._0_4_ = (auVar181._0_4_ + auVar61._0_4_) * 0.33333334;
          auVar86._4_4_ = (auVar181._4_4_ + auVar61._4_4_) * 0.33333334;
          auVar86._8_4_ = (auVar181._8_4_ + auVar61._8_4_) * 0.33333334;
          auVar86._12_4_ = (auVar181._12_4_ + auVar61._12_4_) * 0.33333334;
          auVar34 = vsubps_avx(_local_248,auVar86);
          auVar200._8_4_ = 0xff800000;
          auVar200._0_8_ = 0xff800000ff800000;
          auVar200._12_4_ = 0xff800000;
          auVar200._16_4_ = 0xff800000;
          auVar200._20_4_ = 0xff800000;
          auVar200._24_4_ = 0xff800000;
          auVar200._28_4_ = 0xff800000;
          auVar9 = vmaxps_avx(auVar200,auVar201);
          auVar173 = vmaxps_avx(auVar200,auVar140);
          auVar92 = vmaxps_avx(auVar200,auVar154);
          auVar174 = vmaxps_avx(auVar174,auVar41);
          auVar9 = vmaxps_avx(auVar9,auVar174);
          auVar174 = vmaxps_avx(auVar141,auVar110);
          auVar173 = vmaxps_avx(auVar173,auVar174);
          auVar174 = vmaxps_avx(auVar13,auVar172);
          auVar92 = vmaxps_avx(auVar92,auVar174);
          auVar174 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar174 = vminps_avx(auVar182,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar35 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar12,auVar12,0xb1);
          auVar174 = vminps_avx(auVar12,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar57 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar57 = vunpcklps_avx(auVar35,auVar57);
          auVar174 = vshufps_avx(auVar194,auVar194,0xb1);
          auVar174 = vminps_avx(auVar194,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar35 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar35 = vinsertps_avx(auVar57,auVar35,0x28);
          auVar174 = vshufps_avx(auVar9,auVar9,0xb1);
          auVar9 = vmaxps_avx(auVar9,auVar174);
          auVar174 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar174);
          auVar57 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar9 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar9 = vmaxps_avx(auVar173,auVar9);
          auVar173 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar173);
          auVar149 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar149 = vunpcklps_avx(auVar57,auVar149);
          auVar9 = vshufps_avx(auVar92,auVar92,0xb1);
          auVar9 = vmaxps_avx(auVar92,auVar9);
          auVar173 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar173);
          auVar57 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar57 = vinsertps_avx(auVar149,auVar57,0x28);
          auVar149 = vshufps_avx(auVar205,auVar205,0);
          auVar86 = vshufps_avx(auVar205,auVar205,0x55);
          auVar32 = vshufps_avx(auVar205,auVar205,0xaa);
          auVar33 = vshufps_avx(auVar34,auVar34,0);
          auVar89 = vshufps_avx(auVar34,auVar34,0x55);
          auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
          auVar58 = vshufps_avx(_local_248,_local_248,0);
          auVar61 = vshufps_avx(_local_248,_local_248,0x55);
          auVar59 = vshufps_avx(_local_248,_local_248,0xaa);
          fVar115 = auVar58._0_4_;
          fVar116 = auVar58._4_4_;
          fVar117 = auVar58._8_4_;
          fVar55 = auVar61._0_4_;
          fVar56 = auVar61._4_4_;
          fVar72 = auVar61._8_4_;
          fVar73 = auVar61._12_4_;
          fVar79 = auVar59._0_4_;
          fVar80 = auVar59._4_4_;
          fVar99 = auVar59._8_4_;
          fVar81 = auVar33._0_4_;
          fVar96 = auVar33._4_4_;
          fVar97 = auVar33._8_4_;
          fVar98 = auVar33._12_4_;
          fVar129 = auVar13._28_4_;
          fVar50 = auVar89._0_4_;
          fVar52 = auVar89._4_4_;
          fVar53 = auVar89._8_4_;
          fVar54 = auVar89._12_4_;
          fVar130 = auVar34._0_4_;
          fVar175 = auVar34._4_4_;
          fVar177 = auVar34._8_4_;
          fVar179 = auVar34._12_4_;
          fVar131 = auVar149._0_4_;
          fVar143 = auVar149._4_4_;
          fVar31 = auVar149._8_4_;
          fVar48 = auVar149._12_4_;
          fVar74 = auVar86._0_4_;
          fVar75 = auVar86._4_4_;
          fVar77 = auVar86._8_4_;
          fVar155 = auVar32._0_4_;
          fVar165 = auVar32._4_4_;
          fVar166 = auVar32._8_4_;
          auVar89._4_4_ = fVar47;
          auVar89._0_4_ = fVar30;
          auVar89._8_4_ = fVar49;
          auVar89._12_4_ = fVar51;
          auVar149 = vshufps_avx(auVar89,auVar89,0);
          fVar51 = auVar149._0_4_;
          fVar76 = auVar149._4_4_;
          fVar78 = auVar149._8_4_;
          auVar202._0_4_ =
               fVar51 * (float)bezier_basis0._476_4_ +
               fVar131 * (float)bezier_basis0._1632_4_ +
               fVar81 * (float)bezier_basis0._2788_4_ + fVar115 * (float)bezier_basis0._3944_4_;
          auVar202._4_4_ =
               fVar76 * (float)bezier_basis0._480_4_ +
               fVar143 * (float)bezier_basis0._1636_4_ +
               fVar96 * (float)bezier_basis0._2792_4_ + fVar116 * (float)bezier_basis0._3948_4_;
          auVar202._8_4_ =
               fVar78 * (float)bezier_basis0._484_4_ +
               fVar31 * (float)bezier_basis0._1640_4_ +
               fVar97 * (float)bezier_basis0._2796_4_ + fVar117 * (float)bezier_basis0._3952_4_;
          auVar202._12_4_ =
               auVar149._12_4_ * (float)bezier_basis0._488_4_ +
               fVar48 * (float)bezier_basis0._1644_4_ +
               fVar98 * (float)bezier_basis0._2800_4_ +
               auVar58._12_4_ * (float)bezier_basis0._3956_4_;
          auVar202._16_4_ =
               fVar51 * (float)bezier_basis0._492_4_ +
               fVar131 * (float)bezier_basis0._1648_4_ +
               fVar81 * (float)bezier_basis0._2804_4_ + fVar115 * (float)bezier_basis0._3960_4_;
          auVar202._20_4_ =
               fVar76 * (float)bezier_basis0._496_4_ +
               fVar143 * (float)bezier_basis0._1652_4_ +
               fVar96 * (float)bezier_basis0._2808_4_ + fVar116 * (float)bezier_basis0._3964_4_;
          auVar202._24_4_ =
               fVar78 * (float)bezier_basis0._500_4_ +
               fVar31 * (float)bezier_basis0._1656_4_ +
               fVar97 * (float)bezier_basis0._2812_4_ + fVar117 * (float)bezier_basis0._3968_4_;
          auVar202._28_4_ = fVar129 + fVar129 + 0.0 + 0.0;
          auVar33 = vshufps_avx(auVar89,auVar89,0x55);
          fVar167 = auVar33._0_4_;
          fVar118 = auVar33._4_4_;
          fVar128 = auVar33._8_4_;
          auVar163._0_4_ =
               (float)bezier_basis0._476_4_ * fVar167 +
               fVar74 * (float)bezier_basis0._1632_4_ +
               fVar50 * (float)bezier_basis0._2788_4_ + fVar55 * (float)bezier_basis0._3944_4_;
          auVar163._4_4_ =
               (float)bezier_basis0._480_4_ * fVar118 +
               fVar75 * (float)bezier_basis0._1636_4_ +
               fVar52 * (float)bezier_basis0._2792_4_ + fVar56 * (float)bezier_basis0._3948_4_;
          auVar163._8_4_ =
               (float)bezier_basis0._484_4_ * fVar128 +
               fVar77 * (float)bezier_basis0._1640_4_ +
               fVar53 * (float)bezier_basis0._2796_4_ + fVar72 * (float)bezier_basis0._3952_4_;
          auVar163._12_4_ =
               (float)bezier_basis0._488_4_ * auVar33._12_4_ +
               auVar86._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar54 * (float)bezier_basis0._2800_4_ + fVar73 * (float)bezier_basis0._3956_4_;
          auVar163._16_4_ =
               (float)bezier_basis0._492_4_ * fVar167 +
               fVar74 * (float)bezier_basis0._1648_4_ +
               fVar50 * (float)bezier_basis0._2804_4_ + fVar55 * (float)bezier_basis0._3960_4_;
          auVar163._20_4_ =
               (float)bezier_basis0._496_4_ * fVar118 +
               fVar75 * (float)bezier_basis0._1652_4_ +
               fVar52 * (float)bezier_basis0._2808_4_ + fVar56 * (float)bezier_basis0._3964_4_;
          auVar163._24_4_ =
               (float)bezier_basis0._500_4_ * fVar128 +
               fVar77 * (float)bezier_basis0._1656_4_ +
               fVar53 * (float)bezier_basis0._2812_4_ + fVar72 * (float)bezier_basis0._3968_4_;
          auVar163._28_4_ = (float)bezier_basis0._504_4_ + fVar129 + fVar129 + 0.0;
          auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
          fVar30 = auVar89._0_4_;
          fVar47 = auVar89._4_4_;
          fVar49 = auVar89._8_4_;
          auVar111._0_4_ =
               fVar30 * (float)bezier_basis0._476_4_ +
               fVar155 * (float)bezier_basis0._1632_4_ +
               fVar130 * (float)bezier_basis0._2788_4_ + fVar79 * (float)bezier_basis0._3944_4_;
          auVar111._4_4_ =
               fVar47 * (float)bezier_basis0._480_4_ +
               fVar165 * (float)bezier_basis0._1636_4_ +
               fVar175 * (float)bezier_basis0._2792_4_ + fVar80 * (float)bezier_basis0._3948_4_;
          auVar111._8_4_ =
               fVar49 * (float)bezier_basis0._484_4_ +
               fVar166 * (float)bezier_basis0._1640_4_ +
               fVar177 * (float)bezier_basis0._2796_4_ + fVar99 * (float)bezier_basis0._3952_4_;
          auVar111._12_4_ =
               auVar89._12_4_ * (float)bezier_basis0._488_4_ +
               auVar32._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar179 * (float)bezier_basis0._2800_4_ +
               auVar59._12_4_ * (float)bezier_basis0._3956_4_;
          auVar111._16_4_ =
               fVar30 * (float)bezier_basis0._492_4_ +
               fVar155 * (float)bezier_basis0._1648_4_ +
               fVar130 * (float)bezier_basis0._2804_4_ + fVar79 * (float)bezier_basis0._3960_4_;
          auVar111._20_4_ =
               fVar47 * (float)bezier_basis0._496_4_ +
               fVar165 * (float)bezier_basis0._1652_4_ +
               fVar175 * (float)bezier_basis0._2808_4_ + fVar80 * (float)bezier_basis0._3964_4_;
          auVar111._24_4_ =
               fVar49 * (float)bezier_basis0._500_4_ +
               fVar166 * (float)bezier_basis0._1656_4_ +
               fVar177 * (float)bezier_basis0._2812_4_ + fVar99 * (float)bezier_basis0._3968_4_;
          auVar111._28_4_ = fVar129 + 0.0 + fVar129 + (float)bezier_basis0._3972_4_ + 0.0;
          fVar129 = fVar98 + 0.0 + fVar54 + 0.0;
          auVar68._0_4_ =
               fVar51 * (float)bezier_basis0._5100_4_ +
               fVar131 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar81 + fVar115 * (float)bezier_basis0._8568_4_;
          auVar68._4_4_ =
               fVar76 * (float)bezier_basis0._5104_4_ +
               fVar143 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar96 + fVar116 * (float)bezier_basis0._8572_4_;
          auVar68._8_4_ =
               fVar78 * (float)bezier_basis0._5108_4_ +
               fVar31 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar97 + fVar117 * (float)bezier_basis0._8576_4_;
          auVar68._12_4_ =
               auVar149._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar48 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar98 +
               auVar58._12_4_ * (float)bezier_basis0._8580_4_;
          auVar68._16_4_ =
               fVar51 * (float)bezier_basis0._5116_4_ +
               fVar131 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar81 + fVar115 * (float)bezier_basis0._8584_4_;
          auVar68._20_4_ =
               fVar76 * (float)bezier_basis0._5120_4_ +
               fVar143 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar96 + fVar116 * (float)bezier_basis0._8588_4_;
          auVar68._24_4_ =
               fVar78 * (float)bezier_basis0._5124_4_ +
               fVar31 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar97 + fVar117 * (float)bezier_basis0._8592_4_;
          auVar68._28_4_ = fVar54 + 0.0 + fVar179 + fVar98 + 0.0;
          auVar42._0_4_ =
               fVar167 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar74 +
               (float)bezier_basis0._7412_4_ * fVar50 + fVar55 * (float)bezier_basis0._8568_4_;
          auVar42._4_4_ =
               fVar118 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar75 +
               (float)bezier_basis0._7416_4_ * fVar52 + fVar56 * (float)bezier_basis0._8572_4_;
          auVar42._8_4_ =
               fVar128 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar77 +
               (float)bezier_basis0._7420_4_ * fVar53 + fVar72 * (float)bezier_basis0._8576_4_;
          auVar42._12_4_ =
               auVar33._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar86._12_4_ +
               (float)bezier_basis0._7424_4_ * fVar54 + fVar73 * (float)bezier_basis0._8580_4_;
          auVar42._16_4_ =
               fVar167 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar74 +
               (float)bezier_basis0._7428_4_ * fVar50 + fVar55 * (float)bezier_basis0._8584_4_;
          auVar42._20_4_ =
               fVar118 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar75 +
               (float)bezier_basis0._7432_4_ * fVar52 + fVar56 * (float)bezier_basis0._8588_4_;
          auVar42._24_4_ =
               fVar128 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar77 +
               (float)bezier_basis0._7436_4_ * fVar53 + fVar72 * (float)bezier_basis0._8592_4_;
          auVar42._28_4_ = (float)bezier_basis0._6284_4_ + fVar129;
          auVar122._0_4_ =
               fVar30 * (float)bezier_basis0._5100_4_ +
               fVar155 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar130 + fVar79 * (float)bezier_basis0._8568_4_;
          auVar122._4_4_ =
               fVar47 * (float)bezier_basis0._5104_4_ +
               fVar165 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar175 + fVar80 * (float)bezier_basis0._8572_4_;
          auVar122._8_4_ =
               fVar49 * (float)bezier_basis0._5108_4_ +
               fVar166 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar177 + fVar99 * (float)bezier_basis0._8576_4_;
          auVar122._12_4_ =
               auVar89._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar32._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar179 +
               auVar59._12_4_ * (float)bezier_basis0._8580_4_;
          auVar122._16_4_ =
               fVar30 * (float)bezier_basis0._5116_4_ +
               fVar155 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar130 + fVar79 * (float)bezier_basis0._8584_4_;
          auVar122._20_4_ =
               fVar47 * (float)bezier_basis0._5120_4_ +
               fVar165 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar175 + fVar80 * (float)bezier_basis0._8588_4_;
          auVar122._24_4_ =
               fVar49 * (float)bezier_basis0._5124_4_ +
               fVar166 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar177 + fVar99 * (float)bezier_basis0._8592_4_;
          auVar122._28_4_ = fVar129 + fVar48 + fVar73 + fVar54;
          auVar9 = vblendps_avx(auVar68,ZEXT832(0) << 0x20,1);
          auVar173 = vblendps_avx(auVar42,ZEXT832(0) << 0x20,1);
          auVar174 = ZEXT832(0) << 0x20;
          auVar92 = vblendps_avx(auVar122,auVar174,1);
          auVar182._4_4_ = auVar9._4_4_ * 0.055555556;
          auVar182._0_4_ = auVar9._0_4_ * 0.055555556;
          auVar182._8_4_ = auVar9._8_4_ * 0.055555556;
          auVar182._12_4_ = auVar9._12_4_ * 0.055555556;
          auVar182._16_4_ = auVar9._16_4_ * 0.055555556;
          auVar182._20_4_ = auVar9._20_4_ * 0.055555556;
          auVar182._24_4_ = auVar9._24_4_ * 0.055555556;
          auVar182._28_4_ = auVar9._28_4_;
          auVar12._4_4_ = auVar173._4_4_ * 0.055555556;
          auVar12._0_4_ = auVar173._0_4_ * 0.055555556;
          auVar12._8_4_ = auVar173._8_4_ * 0.055555556;
          auVar12._12_4_ = auVar173._12_4_ * 0.055555556;
          auVar12._16_4_ = auVar173._16_4_ * 0.055555556;
          auVar12._20_4_ = auVar173._20_4_ * 0.055555556;
          auVar12._24_4_ = auVar173._24_4_ * 0.055555556;
          auVar12._28_4_ = auVar173._28_4_;
          auVar194._4_4_ = auVar92._4_4_ * 0.055555556;
          auVar194._0_4_ = auVar92._0_4_ * 0.055555556;
          auVar194._8_4_ = auVar92._8_4_ * 0.055555556;
          auVar194._12_4_ = auVar92._12_4_ * 0.055555556;
          auVar194._16_4_ = auVar92._16_4_ * 0.055555556;
          auVar194._20_4_ = auVar92._20_4_ * 0.055555556;
          auVar194._24_4_ = auVar92._24_4_ * 0.055555556;
          auVar194._28_4_ = auVar92._28_4_;
          auVar141 = vsubps_avx(auVar202,auVar182);
          auVar13 = vsubps_avx(auVar163,auVar12);
          auVar40 = vsubps_avx(auVar111,auVar194);
          auVar9 = vblendps_avx(auVar68,auVar174,0x80);
          auVar173 = vblendps_avx(auVar42,auVar174,0x80);
          auVar92 = vblendps_avx(auVar122,auVar174,0x80);
          auVar69._0_4_ = auVar202._0_4_ + auVar9._0_4_ * 0.055555556;
          auVar69._4_4_ = auVar202._4_4_ + auVar9._4_4_ * 0.055555556;
          auVar69._8_4_ = auVar202._8_4_ + auVar9._8_4_ * 0.055555556;
          auVar69._12_4_ = auVar202._12_4_ + auVar9._12_4_ * 0.055555556;
          auVar69._16_4_ = auVar202._16_4_ + auVar9._16_4_ * 0.055555556;
          auVar69._20_4_ = auVar202._20_4_ + auVar9._20_4_ * 0.055555556;
          auVar69._24_4_ = auVar202._24_4_ + auVar9._24_4_ * 0.055555556;
          auVar69._28_4_ = auVar202._28_4_ + auVar9._28_4_;
          auVar43._0_4_ = auVar163._0_4_ + auVar173._0_4_ * 0.055555556;
          auVar43._4_4_ = auVar163._4_4_ + auVar173._4_4_ * 0.055555556;
          auVar43._8_4_ = auVar163._8_4_ + auVar173._8_4_ * 0.055555556;
          auVar43._12_4_ = auVar163._12_4_ + auVar173._12_4_ * 0.055555556;
          auVar43._16_4_ = auVar163._16_4_ + auVar173._16_4_ * 0.055555556;
          auVar43._20_4_ = auVar163._20_4_ + auVar173._20_4_ * 0.055555556;
          auVar43._24_4_ = auVar163._24_4_ + auVar173._24_4_ * 0.055555556;
          auVar43._28_4_ = auVar163._28_4_ + auVar173._28_4_;
          auVar123._0_4_ = auVar111._0_4_ + auVar92._0_4_ * 0.055555556;
          auVar123._4_4_ = auVar111._4_4_ + auVar92._4_4_ * 0.055555556;
          auVar123._8_4_ = auVar111._8_4_ + auVar92._8_4_ * 0.055555556;
          auVar123._12_4_ = auVar111._12_4_ + auVar92._12_4_ * 0.055555556;
          auVar123._16_4_ = auVar111._16_4_ + auVar92._16_4_ * 0.055555556;
          auVar123._20_4_ = auVar111._20_4_ + auVar92._20_4_ * 0.055555556;
          auVar123._24_4_ = auVar111._24_4_ + auVar92._24_4_ * 0.055555556;
          auVar123._28_4_ = auVar111._28_4_ + auVar92._28_4_;
          auVar92._8_4_ = 0x7f800000;
          auVar92._0_8_ = 0x7f8000007f800000;
          auVar92._12_4_ = 0x7f800000;
          auVar92._16_4_ = 0x7f800000;
          auVar92._20_4_ = 0x7f800000;
          auVar92._24_4_ = 0x7f800000;
          auVar92._28_4_ = 0x7f800000;
          auVar9 = vminps_avx(auVar92,auVar202);
          auVar173 = vminps_avx(auVar92,auVar163);
          auVar92 = vminps_avx(auVar92,auVar111);
          auVar174 = vminps_avx(auVar141,auVar69);
          auVar182 = vminps_avx(auVar9,auVar174);
          auVar9 = vminps_avx(auVar13,auVar43);
          auVar12 = vminps_avx(auVar173,auVar9);
          auVar9 = vminps_avx(auVar40,auVar123);
          auVar194 = vminps_avx(auVar92,auVar9);
          auVar9 = vmaxps_avx(auVar141,auVar69);
          auVar141._8_4_ = 0xff800000;
          auVar141._0_8_ = 0xff800000ff800000;
          auVar141._12_4_ = 0xff800000;
          auVar141._16_4_ = 0xff800000;
          auVar141._20_4_ = 0xff800000;
          auVar141._24_4_ = 0xff800000;
          auVar141._28_4_ = 0xff800000;
          auVar173 = vmaxps_avx(auVar141,auVar202);
          auVar9 = vmaxps_avx(auVar173,auVar9);
          auVar173 = vmaxps_avx(auVar13,auVar43);
          auVar92 = vmaxps_avx(auVar141,auVar163);
          auVar157._8_4_ = 0xddccb9a2;
          auVar157._0_8_ = 0xddccb9a2ddccb9a2;
          auVar157._12_4_ = 0xddccb9a2;
          auVar164 = ZEXT1664(auVar157);
          auVar173 = vmaxps_avx(auVar92,auVar173);
          auVar92 = vmaxps_avx(auVar40,auVar123);
          auVar174 = vmaxps_avx(auVar141,auVar111);
          auVar92 = vmaxps_avx(auVar174,auVar92);
          auVar174 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar174 = vminps_avx(auVar182,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar149 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar12,auVar12,0xb1);
          auVar174 = vminps_avx(auVar12,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar86 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar86 = vunpcklps_avx(auVar149,auVar86);
          auVar174 = vshufps_avx(auVar194,auVar194,0xb1);
          auVar174 = vminps_avx(auVar194,auVar174);
          auVar182 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar182);
          auVar149 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar149 = vinsertps_avx(auVar86,auVar149,0x28);
          auVar86 = vminps_avx(auVar35,auVar149);
          auVar174 = vshufps_avx(auVar9,auVar9,0xb1);
          auVar9 = vmaxps_avx(auVar9,auVar174);
          auVar174 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar174);
          auVar35 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar9 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar9 = vmaxps_avx(auVar173,auVar9);
          auVar173 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar173);
          auVar149 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar149 = vunpcklps_avx(auVar35,auVar149);
          auVar9 = vshufps_avx(auVar92,auVar92,0xb1);
          auVar9 = vmaxps_avx(auVar92,auVar9);
          auVar173 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vmaxps_avx(auVar9,auVar173);
          auVar35 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
          auVar35 = vinsertps_avx(auVar149,auVar35,0x28);
          auVar57 = vmaxps_avx(auVar57,auVar35);
          auVar35 = vcmpps_avx(auVar86,auVar157,6);
          auVar107._8_4_ = 0x5dccb9a2;
          auVar107._0_8_ = 0x5dccb9a25dccb9a2;
          auVar107._12_4_ = 0x5dccb9a2;
          auVar114 = ZEXT1664(auVar107);
          auVar57 = vcmpps_avx(auVar57,auVar107,1);
          auVar35 = vandps_avx(auVar57,auVar35);
          uVar23 = vmovmskps_avx(auVar35);
          if ((~(byte)uVar23 & 7) != 0) goto LAB_0124411e;
          lVar25 = lVar25 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar25);
        pcVar7 = (pBVar3->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar3->super_RawBufferView).stride;
        fVar82 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        auVar35 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar24),
                                ZEXT416((uint)(fVar82 * *(float *)(pcVar7 + sVar8 * uVar24 + 0xc))),
                                0x30);
        auVar57 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar28),
                                ZEXT416((uint)(fVar82 * *(float *)(pcVar7 + sVar8 * uVar28 + 0xc))),
                                0x30);
        auVar149 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar29),
                                 ZEXT416((uint)(fVar82 * *(float *)(pcVar7 + sVar8 * uVar29 + 0xc)))
                                 ,0x30);
        auVar86 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar27),
                                ZEXT416((uint)(fVar82 * *(float *)(pcVar7 + sVar8 * uVar27 + 0xc))),
                                0x30);
        pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar7 = (pBVar4->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar4->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar7 + uVar24 * sVar8);
        fVar129 = *pfVar1;
        fVar130 = pfVar1[1];
        fVar175 = pfVar1[2];
        fVar177 = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + uVar28 * sVar8);
        fVar179 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar47 = pfVar1[2];
        fVar49 = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + uVar29 * sVar8);
        fVar51 = *pfVar1;
        fVar81 = pfVar1[1];
        fVar96 = pfVar1[2];
        fVar97 = pfVar1[3];
        pfVar1 = (float *)(pcVar7 + sVar8 * uVar27);
        fVar98 = *pfVar1;
        fVar131 = pfVar1[1];
        fVar143 = pfVar1[2];
        fVar31 = pfVar1[3];
        fVar99 = auVar86._0_4_;
        fVar115 = auVar86._4_4_;
        fVar116 = auVar86._8_4_;
        fVar117 = auVar86._12_4_;
        fVar82 = auVar149._0_4_;
        fVar167 = auVar149._4_4_;
        fVar118 = auVar149._8_4_;
        fVar128 = auVar149._12_4_;
        fVar56 = auVar57._0_4_;
        fVar74 = auVar57._4_4_;
        fVar77 = auVar57._8_4_;
        fVar80 = auVar57._12_4_;
        auVar36._0_4_ = fVar56 * 0.0 + fVar82 * 0.5 + fVar99 * 0.0;
        auVar36._4_4_ = fVar74 * 0.0 + fVar167 * 0.5 + fVar115 * 0.0;
        auVar36._8_4_ = fVar77 * 0.0 + fVar118 * 0.5 + fVar116 * 0.0;
        auVar36._12_4_ = fVar80 * 0.0 + fVar128 * 0.5 + fVar117 * 0.0;
        fVar48 = auVar35._0_4_;
        auVar187._0_4_ = fVar48 * 0.5;
        fVar50 = auVar35._4_4_;
        auVar187._4_4_ = fVar50 * 0.5;
        fVar52 = auVar35._8_4_;
        auVar187._8_4_ = fVar52 * 0.5;
        fVar53 = auVar35._12_4_;
        auVar187._12_4_ = fVar53 * 0.5;
        auVar34 = vsubps_avx(auVar36,auVar187);
        auVar188._0_4_ = fVar179 * 0.0 + fVar51 * 0.5 + fVar98 * 0.0;
        auVar188._4_4_ = fVar30 * 0.0 + fVar81 * 0.5 + fVar131 * 0.0;
        auVar188._8_4_ = fVar47 * 0.0 + fVar96 * 0.5 + fVar143 * 0.0;
        auVar188._12_4_ = fVar49 * 0.0 + fVar97 * 0.5 + fVar31 * 0.0;
        auVar206._0_4_ = fVar129 * 0.5;
        auVar206._4_4_ = fVar130 * 0.5;
        auVar206._8_4_ = fVar175 * 0.5;
        auVar206._12_4_ = fVar177 * 0.5;
        auVar86 = vsubps_avx(auVar188,auVar206);
        fVar54 = fVar48 * -0.0 + fVar56 + fVar82 * 0.0 + fVar99 * -0.0;
        fVar72 = fVar50 * -0.0 + fVar74 + fVar167 * 0.0 + fVar115 * -0.0;
        fVar75 = fVar52 * -0.0 + fVar77 + fVar118 * 0.0 + fVar116 * -0.0;
        fVar78 = fVar53 * -0.0 + fVar80 + fVar128 * 0.0 + fVar117 * -0.0;
        fVar55 = fVar48 * -0.0 + fVar56 * 0.0 + fVar99 * -0.0 + fVar82;
        fVar73 = fVar50 * -0.0 + fVar74 * 0.0 + fVar115 * -0.0 + fVar167;
        fVar76 = fVar52 * -0.0 + fVar77 * 0.0 + fVar116 * -0.0 + fVar118;
        fVar79 = fVar53 * -0.0 + fVar80 * 0.0 + fVar117 * -0.0 + fVar128;
        auVar145._0_4_ = fVar82 * 0.0 + fVar99 * 0.5;
        auVar145._4_4_ = fVar167 * 0.0 + fVar115 * 0.5;
        auVar145._8_4_ = fVar118 * 0.0 + fVar116 * 0.5;
        auVar145._12_4_ = fVar128 * 0.0 + fVar117 * 0.5;
        auVar207._0_4_ = fVar129 * -0.0 + fVar51 * 0.0 + fVar98 * -0.0 + fVar179;
        auVar207._4_4_ = fVar130 * -0.0 + fVar81 * 0.0 + fVar131 * -0.0 + fVar30;
        auVar207._8_4_ = fVar175 * -0.0 + fVar96 * 0.0 + fVar143 * -0.0 + fVar47;
        auVar207._12_4_ = fVar177 * -0.0 + fVar97 * 0.0 + fVar31 * -0.0 + fVar49;
        auVar134._0_4_ = fVar56 * 0.5;
        auVar134._4_4_ = fVar74 * 0.5;
        auVar134._8_4_ = fVar77 * 0.5;
        auVar134._12_4_ = fVar80 * 0.5;
        auVar35 = vsubps_avx(auVar145,auVar134);
        auVar146._0_4_ = fVar48 * 0.0 + auVar35._0_4_;
        auVar146._4_4_ = fVar50 * 0.0 + auVar35._4_4_;
        auVar146._8_4_ = fVar52 * 0.0 + auVar35._8_4_;
        auVar146._12_4_ = fVar53 * 0.0 + auVar35._12_4_;
        auVar63._0_4_ = fVar129 * -0.0 + fVar179 * 0.0 + fVar51 + fVar98 * -0.0;
        auVar63._4_4_ = fVar130 * -0.0 + fVar30 * 0.0 + fVar81 + fVar131 * -0.0;
        auVar63._8_4_ = fVar175 * -0.0 + fVar47 * 0.0 + fVar96 + fVar143 * -0.0;
        auVar63._12_4_ = fVar177 * -0.0 + fVar49 * 0.0 + fVar97 + fVar31 * -0.0;
        auVar135._0_4_ = fVar51 * 0.0 + fVar98 * 0.5;
        auVar135._4_4_ = fVar81 * 0.0 + fVar131 * 0.5;
        auVar135._8_4_ = fVar96 * 0.0 + fVar143 * 0.5;
        auVar135._12_4_ = fVar97 * 0.0 + fVar31 * 0.5;
        auVar151._0_4_ = fVar179 * 0.5;
        auVar151._4_4_ = fVar30 * 0.5;
        auVar151._8_4_ = fVar47 * 0.5;
        auVar151._12_4_ = fVar49 * 0.5;
        auVar35 = vsubps_avx(auVar135,auVar151);
        auVar87._0_4_ = fVar129 * 0.0 + auVar35._0_4_;
        auVar87._4_4_ = fVar130 * 0.0 + auVar35._4_4_;
        auVar87._8_4_ = fVar175 * 0.0 + auVar35._8_4_;
        auVar87._12_4_ = fVar177 * 0.0 + auVar35._12_4_;
        auVar35 = vshufps_avx(auVar34,auVar34,0xc9);
        auVar57 = vshufps_avx(auVar207,auVar207,0xc9);
        fVar31 = auVar34._0_4_;
        auVar152._0_4_ = fVar31 * auVar57._0_4_;
        fVar48 = auVar34._4_4_;
        auVar152._4_4_ = fVar48 * auVar57._4_4_;
        fVar50 = auVar34._8_4_;
        auVar152._8_4_ = fVar50 * auVar57._8_4_;
        fVar52 = auVar34._12_4_;
        auVar152._12_4_ = fVar52 * auVar57._12_4_;
        auVar158._0_4_ = auVar207._0_4_ * auVar35._0_4_;
        auVar158._4_4_ = auVar207._4_4_ * auVar35._4_4_;
        auVar158._8_4_ = auVar207._8_4_ * auVar35._8_4_;
        auVar158._12_4_ = auVar207._12_4_ * auVar35._12_4_;
        auVar57 = vsubps_avx(auVar158,auVar152);
        auVar149 = vshufps_avx(auVar57,auVar57,0xc9);
        auVar57 = vshufps_avx(auVar86,auVar86,0xc9);
        auVar159._0_4_ = auVar57._0_4_ * fVar31;
        auVar159._4_4_ = auVar57._4_4_ * fVar48;
        auVar159._8_4_ = auVar57._8_4_ * fVar50;
        auVar159._12_4_ = auVar57._12_4_ * fVar52;
        auVar136._0_4_ = auVar35._0_4_ * auVar86._0_4_;
        auVar136._4_4_ = auVar35._4_4_ * auVar86._4_4_;
        auVar136._8_4_ = auVar35._8_4_ * auVar86._8_4_;
        auVar136._12_4_ = auVar35._12_4_ * auVar86._12_4_;
        auVar35 = vsubps_avx(auVar136,auVar159);
        auVar86 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar35 = vshufps_avx(auVar146,auVar146,0xc9);
        auVar57 = vshufps_avx(auVar63,auVar63,0xc9);
        auVar170._0_4_ = auVar57._0_4_ * auVar146._0_4_;
        auVar170._4_4_ = auVar57._4_4_ * auVar146._4_4_;
        auVar170._8_4_ = auVar57._8_4_ * auVar146._8_4_;
        auVar170._12_4_ = auVar57._12_4_ * auVar146._12_4_;
        auVar64._0_4_ = auVar35._0_4_ * auVar63._0_4_;
        auVar64._4_4_ = auVar35._4_4_ * auVar63._4_4_;
        auVar64._8_4_ = auVar35._8_4_ * auVar63._8_4_;
        auVar64._12_4_ = auVar35._12_4_ * auVar63._12_4_;
        auVar57 = vsubps_avx(auVar64,auVar170);
        auVar32 = vshufps_avx(auVar57,auVar57,0xc9);
        auVar57 = vshufps_avx(auVar87,auVar87,0xc9);
        auVar171._0_4_ = auVar57._0_4_ * auVar146._0_4_;
        auVar171._4_4_ = auVar57._4_4_ * auVar146._4_4_;
        auVar171._8_4_ = auVar57._8_4_ * auVar146._8_4_;
        auVar171._12_4_ = auVar57._12_4_ * auVar146._12_4_;
        auVar88._0_4_ = auVar35._0_4_ * auVar87._0_4_;
        auVar88._4_4_ = auVar35._4_4_ * auVar87._4_4_;
        auVar88._8_4_ = auVar35._8_4_ * auVar87._8_4_;
        auVar88._12_4_ = auVar35._12_4_ * auVar87._12_4_;
        auVar57 = vsubps_avx(auVar88,auVar171);
        auVar35 = vdpps_avx(auVar149,auVar149,0x7f);
        auVar33 = vshufps_avx(auVar57,auVar57,0xc9);
        fVar129 = auVar35._0_4_;
        auVar61 = ZEXT416((uint)fVar129);
        auVar57 = vrsqrtss_avx(auVar61,auVar61);
        fVar82 = auVar57._0_4_;
        auVar57 = vdpps_avx(auVar149,auVar86,0x7f);
        auVar89 = ZEXT416((uint)(fVar82 * 1.5 - fVar129 * 0.5 * fVar82 * fVar82 * fVar82));
        auVar89 = vshufps_avx(auVar89,auVar89,0);
        fVar82 = auVar89._0_4_ * auVar149._0_4_;
        fVar167 = auVar89._4_4_ * auVar149._4_4_;
        fVar118 = auVar89._8_4_ * auVar149._8_4_;
        fVar128 = auVar89._12_4_ * auVar149._12_4_;
        auVar35 = vshufps_avx(auVar35,auVar35,0);
        auVar160._0_4_ = auVar35._0_4_ * auVar86._0_4_;
        auVar160._4_4_ = auVar35._4_4_ * auVar86._4_4_;
        auVar160._8_4_ = auVar35._8_4_ * auVar86._8_4_;
        auVar160._12_4_ = auVar35._12_4_ * auVar86._12_4_;
        auVar35 = vshufps_avx(auVar57,auVar57,0);
        auVar153._0_4_ = auVar35._0_4_ * auVar149._0_4_;
        auVar153._4_4_ = auVar35._4_4_ * auVar149._4_4_;
        auVar153._8_4_ = auVar35._8_4_ * auVar149._8_4_;
        auVar153._12_4_ = auVar35._12_4_ * auVar149._12_4_;
        auVar58 = vsubps_avx(auVar160,auVar153);
        auVar57 = vrcpss_avx(auVar61,auVar61);
        auVar35 = vdpps_avx(auVar32,auVar32,0x7f);
        auVar57 = ZEXT416((uint)(auVar57._0_4_ * (2.0 - fVar129 * auVar57._0_4_)));
        auVar149 = vshufps_avx(auVar57,auVar57,0);
        fVar129 = auVar35._0_4_;
        auVar61 = ZEXT416((uint)fVar129);
        auVar57 = vrsqrtss_avx(auVar61,auVar61);
        fVar130 = auVar57._0_4_;
        auVar57 = ZEXT416((uint)(fVar130 * 1.5 - fVar129 * 0.5 * fVar130 * fVar130 * fVar130));
        auVar86 = vshufps_avx(auVar57,auVar57,0);
        auVar57 = vdpps_avx(auVar32,auVar33,0x7f);
        fVar130 = auVar86._0_4_ * auVar32._0_4_;
        fVar175 = auVar86._4_4_ * auVar32._4_4_;
        fVar177 = auVar86._8_4_ * auVar32._8_4_;
        fVar179 = auVar86._12_4_ * auVar32._12_4_;
        auVar35 = vshufps_avx(auVar35,auVar35,0);
        auVar137._0_4_ = auVar35._0_4_ * auVar33._0_4_;
        auVar137._4_4_ = auVar35._4_4_ * auVar33._4_4_;
        auVar137._8_4_ = auVar35._8_4_ * auVar33._8_4_;
        auVar137._12_4_ = auVar35._12_4_ * auVar33._12_4_;
        auVar35 = vshufps_avx(auVar57,auVar57,0);
        auVar65._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar65._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar65._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar65._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar33 = vsubps_avx(auVar137,auVar65);
        auVar35 = vrcpss_avx(auVar61,auVar61);
        auVar35 = ZEXT416((uint)((2.0 - fVar129 * auVar35._0_4_) * auVar35._0_4_));
        auVar35 = vshufps_avx(auVar35,auVar35,0);
        auVar19._4_4_ = fVar72;
        auVar19._0_4_ = fVar54;
        auVar19._8_4_ = fVar75;
        auVar19._12_4_ = fVar78;
        auVar57 = vshufps_avx(auVar19,auVar19,0xff);
        auVar161._0_4_ = auVar57._0_4_ * fVar82;
        auVar161._4_4_ = auVar57._4_4_ * fVar167;
        auVar161._8_4_ = auVar57._8_4_ * fVar118;
        auVar161._12_4_ = auVar57._12_4_ * fVar128;
        auVar61 = vsubps_avx(auVar19,auVar161);
        auVar32 = vshufps_avx(auVar34,auVar34,0xff);
        auVar138._0_4_ =
             auVar32._0_4_ * fVar82 + auVar57._0_4_ * auVar89._0_4_ * auVar149._0_4_ * auVar58._0_4_
        ;
        auVar138._4_4_ =
             auVar32._4_4_ * fVar167 +
             auVar57._4_4_ * auVar89._4_4_ * auVar149._4_4_ * auVar58._4_4_;
        auVar138._8_4_ =
             auVar32._8_4_ * fVar118 +
             auVar57._8_4_ * auVar89._8_4_ * auVar149._8_4_ * auVar58._8_4_;
        auVar138._12_4_ =
             auVar32._12_4_ * fVar128 +
             auVar57._12_4_ * auVar89._12_4_ * auVar149._12_4_ * auVar58._12_4_;
        auVar32 = vsubps_avx(auVar34,auVar138);
        fVar54 = auVar161._0_4_ + fVar54;
        fVar72 = auVar161._4_4_ + fVar72;
        fVar75 = auVar161._8_4_ + fVar75;
        fVar78 = auVar161._12_4_ + fVar78;
        auVar21._4_4_ = fVar73;
        auVar21._0_4_ = fVar55;
        auVar21._8_4_ = fVar76;
        auVar21._12_4_ = fVar79;
        auVar57 = vshufps_avx(auVar21,auVar21,0xff);
        auVar121._0_4_ = fVar130 * auVar57._0_4_;
        auVar121._4_4_ = fVar175 * auVar57._4_4_;
        auVar121._8_4_ = fVar177 * auVar57._8_4_;
        auVar121._12_4_ = fVar179 * auVar57._12_4_;
        auVar89 = vsubps_avx(auVar21,auVar121);
        auVar149 = vshufps_avx(auVar146,auVar146,0xff);
        auVar37._0_4_ =
             fVar130 * auVar149._0_4_ +
             auVar57._0_4_ * auVar86._0_4_ * auVar33._0_4_ * auVar35._0_4_;
        auVar37._4_4_ =
             fVar175 * auVar149._4_4_ +
             auVar57._4_4_ * auVar86._4_4_ * auVar33._4_4_ * auVar35._4_4_;
        auVar37._8_4_ =
             fVar177 * auVar149._8_4_ +
             auVar57._8_4_ * auVar86._8_4_ * auVar33._8_4_ * auVar35._8_4_;
        auVar37._12_4_ =
             fVar179 * auVar149._12_4_ +
             auVar57._12_4_ * auVar86._12_4_ * auVar33._12_4_ * auVar35._12_4_;
        auVar35 = vsubps_avx(auVar146,auVar37);
        auVar38._0_4_ = auVar35._0_4_ * 0.33333334;
        auVar38._4_4_ = auVar35._4_4_ * 0.33333334;
        auVar38._8_4_ = auVar35._8_4_ * 0.33333334;
        auVar38._12_4_ = auVar35._12_4_ * 0.33333334;
        auVar33 = vsubps_avx(auVar89,auVar38);
        auVar35 = vshufps_avx(auVar33,auVar33,0);
        auVar57 = vshufps_avx(auVar33,auVar33,0x55);
        auVar149 = vshufps_avx(auVar89,auVar89,0);
        auVar86 = vshufps_avx(auVar89,auVar89,0x55);
        fVar184 = auVar149._0_4_;
        fVar190 = auVar149._4_4_;
        fVar191 = auVar149._8_4_;
        fVar192 = auVar149._12_4_;
        fVar56 = auVar35._0_4_;
        fVar74 = auVar35._4_4_;
        fVar77 = auVar35._8_4_;
        fVar80 = auVar35._12_4_;
        fVar168 = auVar86._0_4_;
        fVar176 = auVar86._4_4_;
        fVar178 = auVar86._8_4_;
        fVar180 = auVar86._12_4_;
        fVar99 = auVar57._0_4_;
        fVar115 = auVar57._4_4_;
        fVar116 = auVar57._8_4_;
        fVar117 = auVar57._12_4_;
        auVar35 = vshufps_avx(auVar33,auVar33,0xaa);
        auVar57 = vshufps_avx(auVar89,auVar89,0xaa);
        fVar204 = auVar57._0_4_;
        fVar209 = auVar57._4_4_;
        fVar210 = auVar57._8_4_;
        fVar193 = auVar35._0_4_;
        fVar197 = auVar35._4_4_;
        fVar198 = auVar35._8_4_;
        fVar199 = auVar35._12_4_;
        auVar139._0_4_ = auVar61._0_4_ + auVar32._0_4_ * 0.33333334;
        auVar139._4_4_ = auVar61._4_4_ + auVar32._4_4_ * 0.33333334;
        auVar139._8_4_ = auVar61._8_4_ + auVar32._8_4_ * 0.33333334;
        auVar139._12_4_ = auVar61._12_4_ + auVar32._12_4_ * 0.33333334;
        auVar35 = vshufps_avx(auVar139,auVar139,0);
        fVar82 = auVar35._0_4_;
        fVar130 = auVar35._4_4_;
        fVar47 = auVar35._8_4_;
        fVar97 = auVar35._12_4_;
        auVar35 = vshufps_avx(auVar139,auVar139,0x55);
        fVar167 = auVar35._0_4_;
        fVar175 = auVar35._4_4_;
        fVar49 = auVar35._8_4_;
        fVar98 = auVar35._12_4_;
        auVar35 = vshufps_avx(auVar139,auVar139,0xaa);
        fVar118 = auVar35._0_4_;
        fVar177 = auVar35._4_4_;
        fVar51 = auVar35._8_4_;
        fVar131 = auVar35._12_4_;
        auVar35 = vshufps_avx(auVar61,auVar61,0);
        fVar128 = auVar35._0_4_;
        fVar179 = auVar35._4_4_;
        fVar81 = auVar35._8_4_;
        fVar143 = auVar35._12_4_;
        auVar203._0_4_ =
             (float)bezier_basis0._476_4_ * fVar128 +
             (float)bezier_basis0._1632_4_ * fVar82 +
             fVar56 * (float)bezier_basis0._2788_4_ + fVar184 * (float)bezier_basis0._3944_4_;
        auVar203._4_4_ =
             (float)bezier_basis0._480_4_ * fVar179 +
             (float)bezier_basis0._1636_4_ * fVar130 +
             fVar74 * (float)bezier_basis0._2792_4_ + fVar190 * (float)bezier_basis0._3948_4_;
        auVar203._8_4_ =
             (float)bezier_basis0._484_4_ * fVar81 +
             (float)bezier_basis0._1640_4_ * fVar47 +
             fVar77 * (float)bezier_basis0._2796_4_ + fVar191 * (float)bezier_basis0._3952_4_;
        auVar203._12_4_ =
             (float)bezier_basis0._488_4_ * fVar143 +
             (float)bezier_basis0._1644_4_ * fVar97 +
             fVar80 * (float)bezier_basis0._2800_4_ + fVar192 * (float)bezier_basis0._3956_4_;
        auVar203._16_4_ =
             (float)bezier_basis0._492_4_ * fVar128 +
             (float)bezier_basis0._1648_4_ * fVar82 +
             fVar56 * (float)bezier_basis0._2804_4_ + fVar184 * (float)bezier_basis0._3960_4_;
        auVar203._20_4_ =
             (float)bezier_basis0._496_4_ * fVar179 +
             (float)bezier_basis0._1652_4_ * fVar130 +
             fVar74 * (float)bezier_basis0._2808_4_ + fVar190 * (float)bezier_basis0._3964_4_;
        auVar203._24_4_ =
             (float)bezier_basis0._500_4_ * fVar81 +
             (float)bezier_basis0._1656_4_ * fVar47 +
             fVar77 * (float)bezier_basis0._2812_4_ + fVar191 * (float)bezier_basis0._3968_4_;
        auVar203._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + fVar80 + 0.0 + 0.0;
        auVar35 = vshufps_avx(auVar61,auVar61,0x55);
        fVar129 = auVar35._0_4_;
        fVar30 = auVar35._4_4_;
        fVar96 = auVar35._8_4_;
        auVar147._0_4_ =
             (float)bezier_basis0._476_4_ * fVar129 +
             (float)bezier_basis0._1632_4_ * fVar167 +
             fVar99 * (float)bezier_basis0._2788_4_ + fVar168 * (float)bezier_basis0._3944_4_;
        auVar147._4_4_ =
             (float)bezier_basis0._480_4_ * fVar30 +
             (float)bezier_basis0._1636_4_ * fVar175 +
             fVar115 * (float)bezier_basis0._2792_4_ + fVar176 * (float)bezier_basis0._3948_4_;
        auVar147._8_4_ =
             (float)bezier_basis0._484_4_ * fVar96 +
             (float)bezier_basis0._1640_4_ * fVar49 +
             fVar116 * (float)bezier_basis0._2796_4_ + fVar178 * (float)bezier_basis0._3952_4_;
        auVar147._12_4_ =
             (float)bezier_basis0._488_4_ * auVar35._12_4_ +
             (float)bezier_basis0._1644_4_ * fVar98 +
             fVar117 * (float)bezier_basis0._2800_4_ + fVar180 * (float)bezier_basis0._3956_4_;
        auVar147._16_4_ =
             (float)bezier_basis0._492_4_ * fVar129 +
             (float)bezier_basis0._1648_4_ * fVar167 +
             fVar99 * (float)bezier_basis0._2804_4_ + fVar168 * (float)bezier_basis0._3960_4_;
        auVar147._20_4_ =
             (float)bezier_basis0._496_4_ * fVar30 +
             (float)bezier_basis0._1652_4_ * fVar175 +
             fVar115 * (float)bezier_basis0._2808_4_ + fVar176 * (float)bezier_basis0._3964_4_;
        auVar147._24_4_ =
             (float)bezier_basis0._500_4_ * fVar96 +
             (float)bezier_basis0._1656_4_ * fVar49 +
             fVar116 * (float)bezier_basis0._2812_4_ + fVar178 * (float)bezier_basis0._3968_4_;
        auVar147._28_4_ = (float)bezier_basis0._504_4_ + fVar117 + fVar80 + 0.0;
        auVar149 = vshufps_avx(auVar61,auVar61,0xaa);
        fVar155 = auVar149._0_4_;
        fVar165 = auVar149._4_4_;
        fVar166 = auVar149._8_4_;
        auVar183._0_4_ =
             fVar155 * (float)bezier_basis0._476_4_ +
             (float)bezier_basis0._1632_4_ * fVar118 +
             fVar193 * (float)bezier_basis0._2788_4_ + fVar204 * (float)bezier_basis0._3944_4_;
        auVar183._4_4_ =
             fVar165 * (float)bezier_basis0._480_4_ +
             (float)bezier_basis0._1636_4_ * fVar177 +
             fVar197 * (float)bezier_basis0._2792_4_ + fVar209 * (float)bezier_basis0._3948_4_;
        auVar183._8_4_ =
             fVar166 * (float)bezier_basis0._484_4_ +
             (float)bezier_basis0._1640_4_ * fVar51 +
             fVar198 * (float)bezier_basis0._2796_4_ + fVar210 * (float)bezier_basis0._3952_4_;
        auVar183._12_4_ =
             auVar149._12_4_ * (float)bezier_basis0._488_4_ +
             (float)bezier_basis0._1644_4_ * fVar131 +
             fVar199 * (float)bezier_basis0._2800_4_ +
             auVar57._12_4_ * (float)bezier_basis0._3956_4_;
        auVar183._16_4_ =
             fVar155 * (float)bezier_basis0._492_4_ +
             (float)bezier_basis0._1648_4_ * fVar118 +
             fVar193 * (float)bezier_basis0._2804_4_ + fVar204 * (float)bezier_basis0._3960_4_;
        auVar183._20_4_ =
             fVar165 * (float)bezier_basis0._496_4_ +
             (float)bezier_basis0._1652_4_ * fVar177 +
             fVar197 * (float)bezier_basis0._2808_4_ + fVar209 * (float)bezier_basis0._3964_4_;
        auVar183._24_4_ =
             fVar166 * (float)bezier_basis0._500_4_ +
             (float)bezier_basis0._1656_4_ * fVar51 +
             fVar198 * (float)bezier_basis0._2812_4_ + fVar210 * (float)bezier_basis0._3968_4_;
        auVar183._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + 0.0 + 0.0;
        fVar53 = fVar97 + fVar192 + 0.0;
        auVar93._0_4_ =
             fVar128 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._6256_4_ * fVar82 +
             (float)bezier_basis0._7412_4_ * fVar56 + fVar184 * (float)bezier_basis0._8568_4_;
        auVar93._4_4_ =
             fVar179 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._6260_4_ * fVar130 +
             (float)bezier_basis0._7416_4_ * fVar74 + fVar190 * (float)bezier_basis0._8572_4_;
        auVar93._8_4_ =
             fVar81 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._6264_4_ * fVar47 +
             (float)bezier_basis0._7420_4_ * fVar77 + fVar191 * (float)bezier_basis0._8576_4_;
        auVar93._12_4_ =
             fVar143 * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._6268_4_ * fVar97 +
             (float)bezier_basis0._7424_4_ * fVar80 + fVar192 * (float)bezier_basis0._8580_4_;
        auVar93._16_4_ =
             fVar128 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._6272_4_ * fVar82 +
             (float)bezier_basis0._7428_4_ * fVar56 + fVar184 * (float)bezier_basis0._8584_4_;
        auVar93._20_4_ =
             fVar179 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._6276_4_ * fVar130 +
             (float)bezier_basis0._7432_4_ * fVar74 + fVar190 * (float)bezier_basis0._8588_4_;
        auVar93._24_4_ =
             fVar81 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._6280_4_ * fVar47 +
             (float)bezier_basis0._7436_4_ * fVar77 + fVar191 * (float)bezier_basis0._8592_4_;
        auVar93._28_4_ = fVar143 + fVar53;
        auVar124._0_4_ =
             fVar129 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._7412_4_ * fVar99 + fVar168 * (float)bezier_basis0._8568_4_ +
             (float)bezier_basis0._6256_4_ * fVar167;
        auVar124._4_4_ =
             fVar30 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._7416_4_ * fVar115 + fVar176 * (float)bezier_basis0._8572_4_ +
             (float)bezier_basis0._6260_4_ * fVar175;
        auVar124._8_4_ =
             fVar96 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._7420_4_ * fVar116 + fVar178 * (float)bezier_basis0._8576_4_ +
             (float)bezier_basis0._6264_4_ * fVar49;
        auVar124._12_4_ =
             auVar35._12_4_ * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._7424_4_ * fVar117 + fVar180 * (float)bezier_basis0._8580_4_ +
             (float)bezier_basis0._6268_4_ * fVar98;
        auVar124._16_4_ =
             fVar129 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._7428_4_ * fVar99 + fVar168 * (float)bezier_basis0._8584_4_ +
             (float)bezier_basis0._6272_4_ * fVar167;
        auVar124._20_4_ =
             fVar30 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._7432_4_ * fVar115 + fVar176 * (float)bezier_basis0._8588_4_ +
             (float)bezier_basis0._6276_4_ * fVar175;
        auVar124._24_4_ =
             fVar96 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._7436_4_ * fVar116 + fVar178 * (float)bezier_basis0._8592_4_ +
             (float)bezier_basis0._6280_4_ * fVar49;
        auVar124._28_4_ = fVar53 + fVar192 + fVar180 + fVar98;
        auVar44._0_4_ =
             fVar155 * (float)bezier_basis0._5100_4_ +
             fVar193 * (float)bezier_basis0._7412_4_ + fVar204 * (float)bezier_basis0._8568_4_ +
             (float)bezier_basis0._6256_4_ * fVar118;
        auVar44._4_4_ =
             fVar165 * (float)bezier_basis0._5104_4_ +
             fVar197 * (float)bezier_basis0._7416_4_ + fVar209 * (float)bezier_basis0._8572_4_ +
             (float)bezier_basis0._6260_4_ * fVar177;
        auVar44._8_4_ =
             fVar166 * (float)bezier_basis0._5108_4_ +
             fVar198 * (float)bezier_basis0._7420_4_ + fVar210 * (float)bezier_basis0._8576_4_ +
             (float)bezier_basis0._6264_4_ * fVar51;
        auVar44._12_4_ =
             auVar149._12_4_ * (float)bezier_basis0._5112_4_ +
             fVar199 * (float)bezier_basis0._7424_4_ +
             auVar57._12_4_ * (float)bezier_basis0._8580_4_ +
             (float)bezier_basis0._6268_4_ * fVar131;
        auVar44._16_4_ =
             fVar155 * (float)bezier_basis0._5116_4_ +
             fVar193 * (float)bezier_basis0._7428_4_ + fVar204 * (float)bezier_basis0._8584_4_ +
             (float)bezier_basis0._6272_4_ * fVar118;
        auVar44._20_4_ =
             fVar165 * (float)bezier_basis0._5120_4_ +
             fVar197 * (float)bezier_basis0._7432_4_ + fVar209 * (float)bezier_basis0._8588_4_ +
             (float)bezier_basis0._6276_4_ * fVar177;
        auVar44._24_4_ =
             fVar166 * (float)bezier_basis0._5124_4_ +
             fVar198 * (float)bezier_basis0._7436_4_ + fVar210 * (float)bezier_basis0._8592_4_ +
             (float)bezier_basis0._6280_4_ * fVar51;
        auVar44._28_4_ = fVar53 + fVar199 + fVar192 + fVar131;
        auVar9 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,1);
        auVar13._4_4_ = auVar9._4_4_ * 0.055555556;
        auVar13._0_4_ = auVar9._0_4_ * 0.055555556;
        auVar13._8_4_ = auVar9._8_4_ * 0.055555556;
        auVar13._12_4_ = auVar9._12_4_ * 0.055555556;
        auVar13._16_4_ = auVar9._16_4_ * 0.055555556;
        auVar13._20_4_ = auVar9._20_4_ * 0.055555556;
        auVar13._24_4_ = auVar9._24_4_ * 0.055555556;
        auVar13._28_4_ = auVar9._28_4_;
        auVar92 = vsubps_avx(auVar203,auVar13);
        auVar9 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
        auVar94._0_4_ = auVar203._0_4_ + auVar9._0_4_ * 0.055555556;
        auVar94._4_4_ = auVar203._4_4_ + auVar9._4_4_ * 0.055555556;
        auVar94._8_4_ = auVar203._8_4_ + auVar9._8_4_ * 0.055555556;
        auVar94._12_4_ = auVar203._12_4_ + auVar9._12_4_ * 0.055555556;
        auVar94._16_4_ = auVar203._16_4_ + auVar9._16_4_ * 0.055555556;
        auVar94._20_4_ = auVar203._20_4_ + auVar9._20_4_ * 0.055555556;
        auVar94._24_4_ = auVar203._24_4_ + auVar9._24_4_ * 0.055555556;
        auVar94._28_4_ = auVar203._28_4_ + auVar9._28_4_;
        auVar142._8_4_ = 0x7f800000;
        auVar142._0_8_ = 0x7f8000007f800000;
        auVar142._12_4_ = 0x7f800000;
        auVar142._16_4_ = 0x7f800000;
        auVar142._20_4_ = 0x7f800000;
        auVar142._24_4_ = 0x7f800000;
        auVar142._28_4_ = 0x7f800000;
        auVar9 = vminps_avx(auVar142,auVar203);
        auVar173 = vminps_avx(auVar92,auVar94);
        auVar182 = vminps_avx(auVar9,auVar173);
        auVar194 = ZEXT832(0) << 0x20;
        auVar9 = vblendps_avx(auVar124,auVar194,1);
        auVar14._4_4_ = auVar9._4_4_ * 0.055555556;
        auVar14._0_4_ = auVar9._0_4_ * 0.055555556;
        auVar14._8_4_ = auVar9._8_4_ * 0.055555556;
        auVar14._12_4_ = auVar9._12_4_ * 0.055555556;
        auVar14._16_4_ = auVar9._16_4_ * 0.055555556;
        auVar14._20_4_ = auVar9._20_4_ * 0.055555556;
        auVar14._24_4_ = auVar9._24_4_ * 0.055555556;
        auVar14._28_4_ = auVar9._28_4_;
        auVar174 = vsubps_avx(auVar147,auVar14);
        auVar9 = vblendps_avx(auVar124,auVar194,0x80);
        auVar125._0_4_ = auVar147._0_4_ + auVar9._0_4_ * 0.055555556;
        auVar125._4_4_ = auVar147._4_4_ + auVar9._4_4_ * 0.055555556;
        auVar125._8_4_ = auVar147._8_4_ + auVar9._8_4_ * 0.055555556;
        auVar125._12_4_ = auVar147._12_4_ + auVar9._12_4_ * 0.055555556;
        auVar125._16_4_ = auVar147._16_4_ + auVar9._16_4_ * 0.055555556;
        auVar125._20_4_ = auVar147._20_4_ + auVar9._20_4_ * 0.055555556;
        auVar125._24_4_ = auVar147._24_4_ + auVar9._24_4_ * 0.055555556;
        auVar125._28_4_ = auVar147._28_4_ + auVar9._28_4_;
        auVar9 = vminps_avx(auVar142,auVar147);
        auVar173 = vminps_avx(auVar174,auVar125);
        auVar12 = vminps_avx(auVar9,auVar173);
        auVar9 = vblendps_avx(auVar44,auVar194,1);
        auVar15._4_4_ = auVar9._4_4_ * 0.055555556;
        auVar15._0_4_ = auVar9._0_4_ * 0.055555556;
        auVar15._8_4_ = auVar9._8_4_ * 0.055555556;
        auVar15._12_4_ = auVar9._12_4_ * 0.055555556;
        auVar15._16_4_ = auVar9._16_4_ * 0.055555556;
        auVar15._20_4_ = auVar9._20_4_ * 0.055555556;
        auVar15._24_4_ = auVar9._24_4_ * 0.055555556;
        auVar15._28_4_ = auVar9._28_4_;
        auVar141 = vsubps_avx(auVar183,auVar15);
        auVar9 = vblendps_avx(auVar44,auVar194,0x80);
        auVar195._0_4_ = auVar183._0_4_ + auVar9._0_4_ * 0.055555556;
        auVar195._4_4_ = auVar183._4_4_ + auVar9._4_4_ * 0.055555556;
        auVar195._8_4_ = auVar183._8_4_ + auVar9._8_4_ * 0.055555556;
        auVar195._12_4_ = auVar183._12_4_ + auVar9._12_4_ * 0.055555556;
        auVar195._16_4_ = auVar183._16_4_ + auVar9._16_4_ * 0.055555556;
        auVar195._20_4_ = auVar183._20_4_ + auVar9._20_4_ * 0.055555556;
        auVar195._24_4_ = auVar183._24_4_ + auVar9._24_4_ * 0.055555556;
        auVar195._28_4_ = auVar183._28_4_ + auVar9._28_4_;
        auVar9 = vminps_avx(auVar142,auVar183);
        auVar173 = vminps_avx(auVar141,auVar195);
        auVar194 = vminps_avx(auVar9,auVar173);
        auVar9 = vmaxps_avx(auVar92,auVar94);
        auVar112._8_4_ = 0xff800000;
        auVar112._0_8_ = 0xff800000ff800000;
        auVar112._12_4_ = 0xff800000;
        auVar112._16_4_ = 0xff800000;
        auVar112._20_4_ = 0xff800000;
        auVar112._24_4_ = 0xff800000;
        auVar112._28_4_ = 0xff800000;
        auVar173 = vmaxps_avx(auVar112,auVar203);
        auVar9 = vmaxps_avx(auVar173,auVar9);
        auVar173 = vmaxps_avx(auVar174,auVar125);
        auVar92 = vmaxps_avx(auVar112,auVar147);
        auVar173 = vmaxps_avx(auVar92,auVar173);
        auVar92 = vmaxps_avx(auVar141,auVar195);
        auVar174 = vmaxps_avx(auVar112,auVar183);
        auVar92 = vmaxps_avx(auVar174,auVar92);
        auVar174 = vshufps_avx(auVar182,auVar182,0xb1);
        auVar174 = vminps_avx(auVar182,auVar174);
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar35 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar174 = vshufps_avx(auVar12,auVar12,0xb1);
        auVar174 = vminps_avx(auVar12,auVar174);
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar57 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar57 = vunpcklps_avx(auVar35,auVar57);
        auVar174 = vshufps_avx(auVar194,auVar194,0xb1);
        auVar174 = vminps_avx(auVar194,auVar174);
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar35 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar35 = vinsertps_avx(auVar57,auVar35,0x28);
        auVar174 = vshufps_avx(auVar9,auVar9,0xb1);
        auVar9 = vmaxps_avx(auVar9,auVar174);
        auVar174 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar174);
        auVar57 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar9 = vshufps_avx(auVar173,auVar173,0xb1);
        auVar9 = vmaxps_avx(auVar173,auVar9);
        auVar173 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar173);
        auVar149 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar90._0_4_ = (auVar146._0_4_ + auVar37._0_4_) * 0.33333334;
        auVar90._4_4_ = (auVar146._4_4_ + auVar37._4_4_) * 0.33333334;
        auVar90._8_4_ = (auVar146._8_4_ + auVar37._8_4_) * 0.33333334;
        auVar90._12_4_ = (auVar146._12_4_ + auVar37._12_4_) * 0.33333334;
        auVar22._4_4_ = fVar73 + auVar121._4_4_;
        auVar22._0_4_ = fVar55 + auVar121._0_4_;
        auVar22._8_4_ = fVar76 + auVar121._8_4_;
        auVar22._12_4_ = fVar79 + auVar121._12_4_;
        auVar32 = vsubps_avx(auVar22,auVar90);
        auVar149 = vunpcklps_avx(auVar57,auVar149);
        auVar9 = vshufps_avx(auVar92,auVar92,0xb1);
        auVar9 = vmaxps_avx(auVar92,auVar9);
        auVar173 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar173);
        auVar57 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar57 = vinsertps_avx(auVar149,auVar57,0x28);
        auVar149 = vshufps_avx(auVar32,auVar32,0);
        auVar86 = vshufps_avx(auVar22,auVar22,0);
        fVar97 = auVar86._0_4_;
        fVar98 = auVar86._4_4_;
        fVar131 = auVar86._8_4_;
        fVar143 = auVar86._12_4_;
        fVar166 = auVar149._0_4_;
        fVar168 = auVar149._4_4_;
        fVar176 = auVar149._8_4_;
        fVar178 = auVar149._12_4_;
        auVar149 = vshufps_avx(auVar32,auVar32,0x55);
        auVar86 = vshufps_avx(auVar22,auVar22,0x55);
        fVar49 = auVar86._0_4_;
        fVar51 = auVar86._4_4_;
        fVar81 = auVar86._8_4_;
        fVar96 = auVar86._12_4_;
        fVar76 = auVar149._0_4_;
        fVar77 = auVar149._4_4_;
        fVar79 = auVar149._8_4_;
        fVar80 = auVar149._12_4_;
        auVar149 = vshufps_avx(auVar32,auVar32,0xaa);
        auVar86 = vshufps_avx(auVar22,auVar22,0xaa);
        fVar53 = auVar86._0_4_;
        fVar55 = auVar86._4_4_;
        fVar56 = auVar86._8_4_;
        fVar73 = auVar86._12_4_;
        fVar99 = auVar149._0_4_;
        fVar115 = auVar149._4_4_;
        fVar117 = auVar149._8_4_;
        fVar165 = auVar149._12_4_;
        auVar20._4_4_ = fVar72;
        auVar20._0_4_ = fVar54;
        auVar20._8_4_ = fVar75;
        auVar20._12_4_ = fVar78;
        auVar162._0_4_ = fVar54 + (fVar31 + auVar138._0_4_) * 0.33333334;
        auVar162._4_4_ = fVar72 + (fVar48 + auVar138._4_4_) * 0.33333334;
        auVar162._8_4_ = fVar75 + (fVar50 + auVar138._8_4_) * 0.33333334;
        auVar162._12_4_ = fVar78 + (fVar52 + auVar138._12_4_) * 0.33333334;
        auVar149 = vshufps_avx(auVar162,auVar162,0);
        fVar54 = auVar149._0_4_;
        fVar72 = auVar149._4_4_;
        fVar74 = auVar149._8_4_;
        fVar75 = auVar149._12_4_;
        auVar149 = vshufps_avx(auVar162,auVar162,0x55);
        fVar78 = auVar149._0_4_;
        fVar116 = auVar149._4_4_;
        fVar155 = auVar149._8_4_;
        auVar86 = vshufps_avx(auVar162,auVar162,0xaa);
        fVar31 = auVar86._0_4_;
        fVar48 = auVar86._4_4_;
        fVar50 = auVar86._8_4_;
        fVar52 = auVar86._12_4_;
        auVar86 = vshufps_avx(auVar20,auVar20,0);
        fVar82 = auVar86._0_4_;
        fVar167 = auVar86._4_4_;
        fVar118 = auVar86._8_4_;
        fVar128 = auVar86._12_4_;
        auVar208._0_4_ =
             fVar82 * (float)bezier_basis0._476_4_ +
             fVar54 * (float)bezier_basis0._1632_4_ +
             fVar166 * (float)bezier_basis0._2788_4_ + fVar97 * (float)bezier_basis0._3944_4_;
        auVar208._4_4_ =
             fVar167 * (float)bezier_basis0._480_4_ +
             fVar72 * (float)bezier_basis0._1636_4_ +
             fVar168 * (float)bezier_basis0._2792_4_ + fVar98 * (float)bezier_basis0._3948_4_;
        auVar208._8_4_ =
             fVar118 * (float)bezier_basis0._484_4_ +
             fVar74 * (float)bezier_basis0._1640_4_ +
             fVar176 * (float)bezier_basis0._2796_4_ + fVar131 * (float)bezier_basis0._3952_4_;
        auVar208._12_4_ =
             fVar128 * (float)bezier_basis0._488_4_ +
             fVar75 * (float)bezier_basis0._1644_4_ +
             fVar178 * (float)bezier_basis0._2800_4_ + fVar143 * (float)bezier_basis0._3956_4_;
        auVar208._16_4_ =
             fVar82 * (float)bezier_basis0._492_4_ +
             fVar54 * (float)bezier_basis0._1648_4_ +
             fVar166 * (float)bezier_basis0._2804_4_ + fVar97 * (float)bezier_basis0._3960_4_;
        auVar208._20_4_ =
             fVar167 * (float)bezier_basis0._496_4_ +
             fVar72 * (float)bezier_basis0._1652_4_ +
             fVar168 * (float)bezier_basis0._2808_4_ + fVar98 * (float)bezier_basis0._3964_4_;
        auVar208._24_4_ =
             fVar118 * (float)bezier_basis0._500_4_ +
             fVar74 * (float)bezier_basis0._1656_4_ +
             fVar176 * (float)bezier_basis0._2812_4_ + fVar131 * (float)bezier_basis0._3968_4_;
        auVar208._28_4_ = fVar165 + 0.0 + 0.0;
        auVar86 = vshufps_avx(auVar20,auVar20,0x55);
        fVar129 = auVar86._0_4_;
        fVar130 = auVar86._4_4_;
        fVar175 = auVar86._8_4_;
        auVar113._0_4_ =
             fVar129 * (float)bezier_basis0._476_4_ +
             fVar78 * (float)bezier_basis0._1632_4_ +
             fVar76 * (float)bezier_basis0._2788_4_ + fVar49 * (float)bezier_basis0._3944_4_;
        auVar113._4_4_ =
             fVar130 * (float)bezier_basis0._480_4_ +
             fVar116 * (float)bezier_basis0._1636_4_ +
             fVar77 * (float)bezier_basis0._2792_4_ + fVar51 * (float)bezier_basis0._3948_4_;
        auVar113._8_4_ =
             fVar175 * (float)bezier_basis0._484_4_ +
             fVar155 * (float)bezier_basis0._1640_4_ +
             fVar79 * (float)bezier_basis0._2796_4_ + fVar81 * (float)bezier_basis0._3952_4_;
        auVar113._12_4_ =
             auVar86._12_4_ * (float)bezier_basis0._488_4_ +
             auVar149._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar80 * (float)bezier_basis0._2800_4_ + fVar96 * (float)bezier_basis0._3956_4_;
        auVar113._16_4_ =
             fVar129 * (float)bezier_basis0._492_4_ +
             fVar78 * (float)bezier_basis0._1648_4_ +
             fVar76 * (float)bezier_basis0._2804_4_ + fVar49 * (float)bezier_basis0._3960_4_;
        auVar113._20_4_ =
             fVar130 * (float)bezier_basis0._496_4_ +
             fVar116 * (float)bezier_basis0._1652_4_ +
             fVar77 * (float)bezier_basis0._2808_4_ + fVar51 * (float)bezier_basis0._3964_4_;
        auVar113._24_4_ =
             fVar175 * (float)bezier_basis0._500_4_ +
             fVar155 * (float)bezier_basis0._1656_4_ +
             fVar79 * (float)bezier_basis0._2812_4_ + fVar81 * (float)bezier_basis0._3968_4_;
        auVar113._28_4_ = auVar195._28_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
        auVar32 = vshufps_avx(auVar20,auVar20,0xaa);
        fVar177 = auVar32._0_4_;
        fVar179 = auVar32._4_4_;
        fVar30 = auVar32._8_4_;
        fVar47 = auVar32._12_4_;
        auVar196._0_4_ =
             fVar177 * (float)bezier_basis0._476_4_ +
             fVar31 * (float)bezier_basis0._1632_4_ +
             fVar99 * (float)bezier_basis0._2788_4_ + fVar53 * (float)bezier_basis0._3944_4_;
        auVar196._4_4_ =
             fVar179 * (float)bezier_basis0._480_4_ +
             fVar48 * (float)bezier_basis0._1636_4_ +
             fVar115 * (float)bezier_basis0._2792_4_ + fVar55 * (float)bezier_basis0._3948_4_;
        auVar196._8_4_ =
             fVar30 * (float)bezier_basis0._484_4_ +
             fVar50 * (float)bezier_basis0._1640_4_ +
             fVar117 * (float)bezier_basis0._2796_4_ + fVar56 * (float)bezier_basis0._3952_4_;
        auVar196._12_4_ =
             fVar47 * (float)bezier_basis0._488_4_ +
             fVar52 * (float)bezier_basis0._1644_4_ +
             fVar165 * (float)bezier_basis0._2800_4_ + fVar73 * (float)bezier_basis0._3956_4_;
        auVar196._16_4_ =
             fVar177 * (float)bezier_basis0._492_4_ +
             fVar31 * (float)bezier_basis0._1648_4_ +
             fVar99 * (float)bezier_basis0._2804_4_ + fVar53 * (float)bezier_basis0._3960_4_;
        auVar196._20_4_ =
             fVar179 * (float)bezier_basis0._496_4_ +
             fVar48 * (float)bezier_basis0._1652_4_ +
             fVar115 * (float)bezier_basis0._2808_4_ + fVar55 * (float)bezier_basis0._3964_4_;
        auVar196._24_4_ =
             fVar30 * (float)bezier_basis0._500_4_ +
             fVar50 * (float)bezier_basis0._1656_4_ +
             fVar117 * (float)bezier_basis0._2812_4_ + fVar56 * (float)bezier_basis0._3968_4_;
        auVar196._28_4_ = auVar195._28_4_ + (float)bezier_basis0._2816_4_ + 0.0 + 0.0;
        auVar70._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar82 +
             fVar54 * (float)bezier_basis0._6256_4_ +
             fVar166 * (float)bezier_basis0._7412_4_ + fVar97 * (float)bezier_basis0._8568_4_;
        auVar70._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar167 +
             fVar72 * (float)bezier_basis0._6260_4_ +
             fVar168 * (float)bezier_basis0._7416_4_ + fVar98 * (float)bezier_basis0._8572_4_;
        auVar70._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar118 +
             fVar74 * (float)bezier_basis0._6264_4_ +
             fVar176 * (float)bezier_basis0._7420_4_ + fVar131 * (float)bezier_basis0._8576_4_;
        auVar70._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar128 +
             fVar75 * (float)bezier_basis0._6268_4_ +
             fVar178 * (float)bezier_basis0._7424_4_ + fVar143 * (float)bezier_basis0._8580_4_;
        auVar70._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar82 +
             fVar54 * (float)bezier_basis0._6272_4_ +
             fVar166 * (float)bezier_basis0._7428_4_ + fVar97 * (float)bezier_basis0._8584_4_;
        auVar70._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar167 +
             fVar72 * (float)bezier_basis0._6276_4_ +
             fVar168 * (float)bezier_basis0._7432_4_ + fVar98 * (float)bezier_basis0._8588_4_;
        auVar70._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar118 +
             fVar74 * (float)bezier_basis0._6280_4_ +
             fVar176 * (float)bezier_basis0._7436_4_ + fVar131 * (float)bezier_basis0._8592_4_;
        auVar70._28_4_ = fVar128 + fVar75 + fVar178 + fVar143;
        auVar45._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar129 +
             fVar78 * (float)bezier_basis0._6256_4_ +
             fVar76 * (float)bezier_basis0._7412_4_ + fVar49 * (float)bezier_basis0._8568_4_;
        auVar45._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar130 +
             fVar116 * (float)bezier_basis0._6260_4_ +
             fVar77 * (float)bezier_basis0._7416_4_ + fVar51 * (float)bezier_basis0._8572_4_;
        auVar45._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar175 +
             fVar155 * (float)bezier_basis0._6264_4_ +
             fVar79 * (float)bezier_basis0._7420_4_ + fVar81 * (float)bezier_basis0._8576_4_;
        auVar45._12_4_ =
             (float)bezier_basis0._5112_4_ * auVar86._12_4_ +
             auVar149._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar80 * (float)bezier_basis0._7424_4_ + fVar96 * (float)bezier_basis0._8580_4_;
        auVar45._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar129 +
             fVar78 * (float)bezier_basis0._6272_4_ +
             fVar76 * (float)bezier_basis0._7428_4_ + fVar49 * (float)bezier_basis0._8584_4_;
        auVar45._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar130 +
             fVar116 * (float)bezier_basis0._6276_4_ +
             fVar77 * (float)bezier_basis0._7432_4_ + fVar51 * (float)bezier_basis0._8588_4_;
        auVar45._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar175 +
             fVar155 * (float)bezier_basis0._6280_4_ +
             fVar79 * (float)bezier_basis0._7436_4_ + fVar81 * (float)bezier_basis0._8592_4_;
        auVar45._28_4_ = (float)bezier_basis0._6284_4_ + fVar75 + fVar80 + fVar96;
        auVar126._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar177 +
             fVar31 * (float)bezier_basis0._6256_4_ +
             (float)bezier_basis0._7412_4_ * fVar99 + fVar53 * (float)bezier_basis0._8568_4_;
        auVar126._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar179 +
             fVar48 * (float)bezier_basis0._6260_4_ +
             (float)bezier_basis0._7416_4_ * fVar115 + fVar55 * (float)bezier_basis0._8572_4_;
        auVar126._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar30 +
             fVar50 * (float)bezier_basis0._6264_4_ +
             (float)bezier_basis0._7420_4_ * fVar117 + fVar56 * (float)bezier_basis0._8576_4_;
        auVar126._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar47 +
             fVar52 * (float)bezier_basis0._6268_4_ +
             (float)bezier_basis0._7424_4_ * fVar165 + fVar73 * (float)bezier_basis0._8580_4_;
        auVar126._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar177 +
             fVar31 * (float)bezier_basis0._6272_4_ +
             (float)bezier_basis0._7428_4_ * fVar99 + fVar53 * (float)bezier_basis0._8584_4_;
        auVar126._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar179 +
             fVar48 * (float)bezier_basis0._6276_4_ +
             (float)bezier_basis0._7432_4_ * fVar115 + fVar55 * (float)bezier_basis0._8588_4_;
        auVar126._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar30 +
             fVar50 * (float)bezier_basis0._6280_4_ +
             (float)bezier_basis0._7436_4_ * fVar117 + fVar56 * (float)bezier_basis0._8592_4_;
        auVar126._28_4_ = fVar47 + fVar52 + fVar80 + fVar73;
        auVar173 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar9 = vblendps_avx(auVar70,auVar173,1);
        auVar173 = vblendps_avx(auVar45,auVar173,1);
        auVar174 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar92 = vblendps_avx(auVar126,auVar174,1);
        auVar16._4_4_ = auVar9._4_4_ * 0.055555556;
        auVar16._0_4_ = auVar9._0_4_ * 0.055555556;
        auVar16._8_4_ = auVar9._8_4_ * 0.055555556;
        auVar16._12_4_ = auVar9._12_4_ * 0.055555556;
        auVar16._16_4_ = auVar9._16_4_ * 0.055555556;
        auVar16._20_4_ = auVar9._20_4_ * 0.055555556;
        auVar16._24_4_ = auVar9._24_4_ * 0.055555556;
        auVar16._28_4_ = auVar9._28_4_;
        auVar17._4_4_ = auVar173._4_4_ * 0.055555556;
        auVar17._0_4_ = auVar173._0_4_ * 0.055555556;
        auVar17._8_4_ = auVar173._8_4_ * 0.055555556;
        auVar17._12_4_ = auVar173._12_4_ * 0.055555556;
        auVar17._16_4_ = auVar173._16_4_ * 0.055555556;
        auVar17._20_4_ = auVar173._20_4_ * 0.055555556;
        auVar17._24_4_ = auVar173._24_4_ * 0.055555556;
        auVar17._28_4_ = auVar173._28_4_;
        auVar18._4_4_ = auVar92._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar92._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar92._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar92._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar92._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar92._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar92._24_4_ * 0.055555556;
        auVar18._28_4_ = auVar92._28_4_;
        auVar141 = vsubps_avx(auVar208,auVar16);
        auVar13 = vsubps_avx(auVar113,auVar17);
        auVar40 = vsubps_avx(auVar196,auVar18);
        auVar9 = vblendps_avx(auVar70,auVar174,0x80);
        auVar173 = vblendps_avx(auVar45,auVar174,0x80);
        auVar92 = vblendps_avx(auVar126,auVar174,0x80);
        auVar71._0_4_ = auVar208._0_4_ + auVar9._0_4_ * 0.055555556;
        auVar71._4_4_ = auVar208._4_4_ + auVar9._4_4_ * 0.055555556;
        auVar71._8_4_ = auVar208._8_4_ + auVar9._8_4_ * 0.055555556;
        auVar71._12_4_ = auVar208._12_4_ + auVar9._12_4_ * 0.055555556;
        auVar71._16_4_ = auVar208._16_4_ + auVar9._16_4_ * 0.055555556;
        auVar71._20_4_ = auVar208._20_4_ + auVar9._20_4_ * 0.055555556;
        auVar71._24_4_ = auVar208._24_4_ + auVar9._24_4_ * 0.055555556;
        auVar71._28_4_ = auVar208._28_4_ + auVar9._28_4_;
        auVar46._0_4_ = auVar113._0_4_ + auVar173._0_4_ * 0.055555556;
        auVar46._4_4_ = auVar113._4_4_ + auVar173._4_4_ * 0.055555556;
        auVar46._8_4_ = auVar113._8_4_ + auVar173._8_4_ * 0.055555556;
        auVar46._12_4_ = auVar113._12_4_ + auVar173._12_4_ * 0.055555556;
        auVar46._16_4_ = auVar113._16_4_ + auVar173._16_4_ * 0.055555556;
        auVar46._20_4_ = auVar113._20_4_ + auVar173._20_4_ * 0.055555556;
        auVar46._24_4_ = auVar113._24_4_ + auVar173._24_4_ * 0.055555556;
        auVar46._28_4_ = auVar113._28_4_ + auVar173._28_4_;
        auVar127._0_4_ = auVar196._0_4_ + auVar92._0_4_ * 0.055555556;
        auVar127._4_4_ = auVar196._4_4_ + auVar92._4_4_ * 0.055555556;
        auVar127._8_4_ = auVar196._8_4_ + auVar92._8_4_ * 0.055555556;
        auVar127._12_4_ = auVar196._12_4_ + auVar92._12_4_ * 0.055555556;
        auVar127._16_4_ = auVar196._16_4_ + auVar92._16_4_ * 0.055555556;
        auVar127._20_4_ = auVar196._20_4_ + auVar92._20_4_ * 0.055555556;
        auVar127._24_4_ = auVar196._24_4_ + auVar92._24_4_ * 0.055555556;
        auVar127._28_4_ = auVar196._28_4_ + auVar92._28_4_;
        auVar95._8_4_ = 0x7f800000;
        auVar95._0_8_ = 0x7f8000007f800000;
        auVar95._12_4_ = 0x7f800000;
        auVar95._16_4_ = 0x7f800000;
        auVar95._20_4_ = 0x7f800000;
        auVar95._24_4_ = 0x7f800000;
        auVar95._28_4_ = 0x7f800000;
        auVar9 = vminps_avx(auVar95,auVar208);
        auVar173 = vminps_avx(auVar95,auVar113);
        auVar92 = vminps_avx(auVar95,auVar196);
        auVar174 = vminps_avx(auVar141,auVar71);
        auVar182 = vminps_avx(auVar9,auVar174);
        auVar9 = vminps_avx(auVar13,auVar46);
        auVar12 = vminps_avx(auVar173,auVar9);
        auVar9 = vminps_avx(auVar40,auVar127);
        auVar194 = vminps_avx(auVar92,auVar9);
        auVar9 = vmaxps_avx(auVar141,auVar71);
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar173 = vmaxps_avx(auVar189,auVar208);
        auVar9 = vmaxps_avx(auVar173,auVar9);
        auVar173 = vmaxps_avx(auVar13,auVar46);
        auVar92 = vmaxps_avx(auVar189,auVar113);
        auVar173 = vmaxps_avx(auVar92,auVar173);
        auVar92 = vmaxps_avx(auVar40,auVar127);
        auVar174 = vmaxps_avx(auVar189,auVar196);
        auVar92 = vmaxps_avx(auVar174,auVar92);
        auVar174 = vshufps_avx(auVar182,auVar182,0xb1);
        auVar174 = vminps_avx(auVar182,auVar174);
        auVar164 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar149 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar174 = vshufps_avx(auVar12,auVar12,0xb1);
        auVar174 = vminps_avx(auVar12,auVar174);
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar86 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar86 = vunpcklps_avx(auVar149,auVar86);
        auVar174 = vshufps_avx(auVar194,auVar194,0xb1);
        auVar174 = vminps_avx(auVar194,auVar174);
        auVar182 = vshufpd_avx(auVar174,auVar174,5);
        auVar174 = vminps_avx(auVar174,auVar182);
        auVar149 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
        auVar149 = vinsertps_avx(auVar86,auVar149,0x28);
        auVar86 = vminps_avx(auVar35,auVar149);
        auVar174 = vshufps_avx(auVar9,auVar9,0xb1);
        auVar9 = vmaxps_avx(auVar9,auVar174);
        auVar174 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar174);
        auVar35 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar9 = vshufps_avx(auVar173,auVar173,0xb1);
        auVar9 = vmaxps_avx(auVar173,auVar9);
        auVar173 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar173);
        auVar149 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar149 = vunpcklps_avx(auVar35,auVar149);
        auVar9 = vshufps_avx(auVar92,auVar92,0xb1);
        auVar9 = vmaxps_avx(auVar92,auVar9);
        auVar173 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vmaxps_avx(auVar9,auVar173);
        auVar35 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
        auVar35 = vinsertps_avx(auVar149,auVar35,0x28);
        auVar149 = vmaxps_avx(auVar57,auVar35);
        auVar108._8_4_ = 0x7fffffff;
        auVar108._0_8_ = 0x7fffffff7fffffff;
        auVar108._12_4_ = 0x7fffffff;
        auVar35 = vandps_avx(auVar86,auVar108);
        auVar57 = vandps_avx(auVar149,auVar108);
        auVar35 = vmaxps_avx(auVar35,auVar57);
        auVar57 = vmovshdup_avx(auVar35);
        auVar57 = vmaxss_avx(auVar57,auVar35);
        auVar35 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vmaxss_avx(auVar35,auVar57);
        auVar35 = ZEXT416((uint)(auVar35._0_4_ * 4.7683716e-07));
        auVar35 = vshufps_avx(auVar35,auVar35,0);
        auVar57 = vsubps_avx(auVar86,auVar35);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar57,ZEXT416(geomID),0x30);
        auVar39._0_4_ = auVar149._0_4_ + auVar35._0_4_;
        auVar39._4_4_ = auVar149._4_4_ + auVar35._4_4_;
        auVar39._8_4_ = auVar149._8_4_ + auVar35._8_4_;
        auVar39._12_4_ = auVar149._12_4_ + auVar35._12_4_;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar39,ZEXT416((uint)uVar26),0x30);
        auVar66._0_4_ = aVar10.x + aVar11.x;
        auVar66._4_4_ = aVar10.y + aVar11.y;
        auVar66._8_4_ = aVar10.z + aVar11.z;
        auVar66._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
        local_208 = vminps_avx(local_208,auVar66);
        auVar114 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        local_218 = vmaxps_avx(local_218,auVar66);
        local_1e8 = vmaxps_avx(local_1e8,(undefined1  [16])aVar11);
        prims[local_220].upper.field_0.field_1 = aVar11;
        local_1f8 = vminps_avx(local_1f8,(undefined1  [16])aVar10);
        prims[local_220].lower.field_0.field_1 = aVar10;
        local_230 = local_230 + 1;
        local_220 = local_220 + 1;
      }
LAB_0124411e:
      uVar26 = uVar26 + 1;
    } while (uVar26 < r->_end);
  }
  else {
    local_230 = 0;
    local_218._8_4_ = 0xff800000;
    local_218._0_8_ = 0xff800000ff800000;
    local_218._12_4_ = 0xff800000;
    local_1e8._8_4_ = 0xff800000;
    local_1e8._0_8_ = 0xff800000ff800000;
    local_1e8._12_4_ = 0xff800000;
    local_208._8_4_ = 0x7f800000;
    local_208._0_8_ = 0x7f8000007f800000;
    local_208._12_4_ = 0x7f800000;
    local_1f8._8_4_ = 0x7f800000;
    local_1f8._0_8_ = 0x7f8000007f800000;
    local_1f8._12_4_ = 0x7f800000;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_1f8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_1f8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_1e8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_1e8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_208._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_208._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_218._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_218._8_8_;
  __return_storage_ptr__->end = local_230;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }